

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  undefined1 auVar20 [16];
  ulong uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  float fVar58;
  float fVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [32];
  byte bVar66;
  ulong uVar67;
  uint uVar68;
  ulong uVar69;
  long lVar70;
  long lVar71;
  Geometry *pGVar72;
  long lVar73;
  uint uVar74;
  byte bVar75;
  ulong uVar76;
  float fVar77;
  float fVar78;
  float fVar141;
  float fVar143;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar100 [16];
  float fVar145;
  float fVar148;
  float fVar149;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined4 uVar162;
  undefined8 uVar163;
  vint4 bi_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar176;
  vint4 bi;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  vint4 ai;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  vint4 ai_1;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  vint4 ai_2;
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  float fVar212;
  float fVar213;
  undefined1 auVar211 [16];
  float fVar214;
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  Geometry *local_618;
  undefined1 (*local_610) [32];
  Precalculations *local_608;
  undefined1 local_600 [32];
  ulong local_5d8;
  LinearSpace3fa *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  
  uVar67 = (ulong)(byte)prim[1];
  lVar73 = uVar67 * 0x25;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x11 + 6)));
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  uVar162 = *(undefined4 *)(prim + lVar73 + 0x12);
  auVar225._4_4_ = uVar162;
  auVar225._0_4_ = uVar162;
  auVar225._8_4_ = uVar162;
  auVar225._12_4_ = uVar162;
  auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar79 = vsubps_avx512vl(auVar92,*(undefined1 (*) [16])(prim + lVar73 + 6));
  fVar19 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar73 + 0x16)) *
           *(float *)(prim + lVar73 + 0x1a);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar98 = vpmovsxwd_avx(auVar92);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar228 = vpmovsxwd_avx(auVar95);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar99 = vpmovsxwd_avx(auVar94);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar100 = vpmovsxwd_avx(auVar93);
  auVar80 = vpbroadcastd_avx512vl();
  auVar92 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar92 = vinsertps_avx512f(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar79 = vmulps_avx512vl(auVar225,auVar79);
  auVar81 = vmulps_avx512vl(auVar225,auVar92);
  auVar82 = vcvtdq2ps_avx512vl(auVar20);
  auVar83 = vcvtdq2ps_avx512vl(auVar88);
  auVar84 = vcvtdq2ps_avx512vl(auVar84);
  auVar85 = vcvtdq2ps_avx512vl(auVar85);
  auVar86 = vcvtdq2ps_avx512vl(auVar86);
  auVar92 = vcvtdq2ps_avx(auVar87);
  auVar95 = vcvtdq2ps_avx(auVar89);
  auVar94 = vcvtdq2ps_avx(auVar90);
  auVar93 = vcvtdq2ps_avx(auVar91);
  uVar162 = auVar81._0_4_;
  auVar217._4_4_ = uVar162;
  auVar217._0_4_ = uVar162;
  auVar217._8_4_ = uVar162;
  auVar217._12_4_ = uVar162;
  auVar20 = vshufps_avx(auVar81,auVar81,0x55);
  auVar88 = vshufps_avx(auVar81,auVar81,0xaa);
  auVar87 = vmulps_avx512vl(auVar88,auVar84);
  auVar164._0_4_ = auVar88._0_4_ * auVar92._0_4_;
  auVar164._4_4_ = auVar88._4_4_ * auVar92._4_4_;
  auVar164._8_4_ = auVar88._8_4_ * auVar92._8_4_;
  auVar164._12_4_ = auVar88._12_4_ * auVar92._12_4_;
  auVar81._0_4_ = auVar93._0_4_ * auVar88._0_4_;
  auVar81._4_4_ = auVar93._4_4_ * auVar88._4_4_;
  auVar81._8_4_ = auVar93._8_4_ * auVar88._8_4_;
  auVar81._12_4_ = auVar93._12_4_ * auVar88._12_4_;
  auVar88 = vfmadd231ps_avx512vl(auVar87,auVar20,auVar83);
  auVar87 = vfmadd231ps_avx512vl(auVar164,auVar20,auVar86);
  auVar20 = vfmadd231ps_fma(auVar81,auVar94,auVar20);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar217,auVar82);
  auVar87 = vfmadd231ps_avx512vl(auVar87,auVar217,auVar85);
  auVar20 = vfmadd231ps_fma(auVar20,auVar95,auVar217);
  auVar89 = vbroadcastss_avx512vl(auVar79);
  auVar90 = vshufps_avx512vl(auVar79,auVar79,0x55);
  auVar91 = vshufps_avx512vl(auVar79,auVar79,0xaa);
  auVar84 = vmulps_avx512vl(auVar91,auVar84);
  auVar92 = vmulps_avx512vl(auVar91,auVar92);
  auVar93 = vmulps_avx512vl(auVar91,auVar93);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar90,auVar83);
  auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar86);
  auVar94 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar94);
  auVar82 = vfmadd231ps_avx512vl(auVar84,auVar89,auVar82);
  auVar83 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar85);
  auVar81 = vfmadd231ps_fma(auVar94,auVar89,auVar95);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar92);
  auVar95 = vandps_avx512vl(auVar88,auVar92);
  auVar222._8_4_ = 0x219392ef;
  auVar222._0_8_ = 0x219392ef219392ef;
  auVar222._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar95,auVar222,1);
  bVar12 = (bool)((byte)uVar69 & 1);
  auVar79._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._0_4_;
  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._4_4_;
  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._8_4_;
  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar88._12_4_;
  auVar95 = vandps_avx512vl(auVar87,auVar92);
  uVar69 = vcmpps_avx512vl(auVar95,auVar222,1);
  bVar12 = (bool)((byte)uVar69 & 1);
  auVar96._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._0_4_;
  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._4_4_;
  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._8_4_;
  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar87._12_4_;
  auVar92 = vandps_avx512vl(auVar20,auVar92);
  uVar69 = vcmpps_avx512vl(auVar92,auVar222,1);
  bVar12 = (bool)((byte)uVar69 & 1);
  auVar97._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._0_4_;
  bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._4_4_;
  bVar12 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._8_4_;
  bVar12 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar20._12_4_;
  auVar95 = vrcp14ps_avx512vl(auVar79);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar79,auVar95,auVar223);
  auVar93 = vfmadd132ps_fma(auVar92,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar96);
  auVar92 = vfnmadd213ps_fma(auVar96,auVar95,auVar223);
  auVar91 = vfmadd132ps_fma(auVar92,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar97);
  auVar92 = vfnmadd213ps_fma(auVar97,auVar95,auVar223);
  auVar79 = vfmadd132ps_fma(auVar92,auVar95,auVar95);
  auVar189._4_4_ = fVar19;
  auVar189._0_4_ = fVar19;
  auVar189._8_4_ = fVar19;
  auVar189._12_4_ = fVar19;
  auVar92 = vcvtdq2ps_avx(auVar98);
  auVar95 = vcvtdq2ps_avx(auVar228);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar98 = vfmadd213ps_fma(auVar95,auVar189,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar99);
  auVar95 = vcvtdq2ps_avx(auVar100);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar228 = vfmadd213ps_fma(auVar95,auVar189,auVar92);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar92 = vpmovsxwd_avx(auVar20);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar67 * 0x16 + 6);
  auVar95 = vpmovsxwd_avx(auVar88);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar95,auVar92);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar67 * 0x14 + 6);
  auVar95 = vpmovsxwd_avx(auVar84);
  auVar94 = vfmadd213ps_fma(auVar94,auVar189,auVar92);
  auVar92 = vcvtdq2ps_avx(auVar95);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar95 = vpmovsxwd_avx(auVar85);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar20 = vfmadd213ps_fma(auVar95,auVar189,auVar92);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar92 = vpmovsxwd_avx(auVar86);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar67 * 0x21 + 6);
  auVar95 = vpmovsxwd_avx(auVar87);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar88 = vfmadd213ps_fma(auVar95,auVar189,auVar92);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar67 * 0x1f + 6);
  auVar92 = vpmovsxwd_avx(auVar89);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar95 = vpmovsxwd_avx(auVar90);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar92);
  auVar95 = vfmadd213ps_fma(auVar95,auVar189,auVar92);
  auVar92 = vsubps_avx(auVar98,auVar82);
  auVar190._0_4_ = auVar93._0_4_ * auVar92._0_4_;
  auVar190._4_4_ = auVar93._4_4_ * auVar92._4_4_;
  auVar190._8_4_ = auVar93._8_4_ * auVar92._8_4_;
  auVar190._12_4_ = auVar93._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar228,auVar82);
  auVar169._0_4_ = auVar93._0_4_ * auVar92._0_4_;
  auVar169._4_4_ = auVar93._4_4_ * auVar92._4_4_;
  auVar169._8_4_ = auVar93._8_4_ * auVar92._8_4_;
  auVar169._12_4_ = auVar93._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar94,auVar83);
  auVar198._0_4_ = auVar91._0_4_ * auVar92._0_4_;
  auVar198._4_4_ = auVar91._4_4_ * auVar92._4_4_;
  auVar198._8_4_ = auVar91._8_4_ * auVar92._8_4_;
  auVar198._12_4_ = auVar91._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar20,auVar83);
  auVar82._0_4_ = auVar91._0_4_ * auVar92._0_4_;
  auVar82._4_4_ = auVar91._4_4_ * auVar92._4_4_;
  auVar82._8_4_ = auVar91._8_4_ * auVar92._8_4_;
  auVar82._12_4_ = auVar91._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar88,auVar81);
  auVar83._0_4_ = auVar79._0_4_ * auVar92._0_4_;
  auVar83._4_4_ = auVar79._4_4_ * auVar92._4_4_;
  auVar83._8_4_ = auVar79._8_4_ * auVar92._8_4_;
  auVar83._12_4_ = auVar79._12_4_ * auVar92._12_4_;
  auVar92 = vsubps_avx(auVar95,auVar81);
  auVar100._0_4_ = auVar79._0_4_ * auVar92._0_4_;
  auVar100._4_4_ = auVar79._4_4_ * auVar92._4_4_;
  auVar100._8_4_ = auVar79._8_4_ * auVar92._8_4_;
  auVar100._12_4_ = auVar79._12_4_ * auVar92._12_4_;
  auVar92 = vpminsd_avx(auVar190,auVar169);
  auVar95 = vpminsd_avx(auVar198,auVar82);
  auVar92 = vmaxps_avx(auVar92,auVar95);
  auVar95 = vpminsd_avx(auVar83,auVar100);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar91._4_4_ = uVar162;
  auVar91._0_4_ = uVar162;
  auVar91._8_4_ = uVar162;
  auVar91._12_4_ = uVar162;
  auVar95 = vmaxps_avx512vl(auVar95,auVar91);
  auVar92 = vmaxps_avx(auVar92,auVar95);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  local_310 = vmulps_avx512vl(auVar92,auVar98);
  auVar92 = vpmaxsd_avx(auVar190,auVar169);
  auVar95 = vpmaxsd_avx(auVar198,auVar82);
  auVar92 = vminps_avx(auVar92,auVar95);
  auVar95 = vpmaxsd_avx(auVar83,auVar100);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar228._4_4_ = uVar162;
  auVar228._0_4_ = uVar162;
  auVar228._8_4_ = uVar162;
  auVar228._12_4_ = uVar162;
  auVar95 = vminps_avx512vl(auVar95,auVar228);
  auVar92 = vminps_avx(auVar92,auVar95);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar99);
  uVar163 = vcmpps_avx512vl(local_310,auVar92,2);
  uVar22 = vpcmpgtd_avx512vl(auVar80,_DAT_01f4ad30);
  local_5c8 = (ulong)((byte)uVar163 & 0xf & (byte)uVar22);
  local_5d0 = pre->ray_space + k;
  local_610 = (undefined1 (*) [32])&local_140;
  local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar230 = ZEXT464(0xbf800000);
  local_608 = pre;
  do {
    if (local_5c8 == 0) {
      return;
    }
    lVar73 = 0;
    for (uVar69 = local_5c8; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar73 = lVar73 + 1;
    }
    uVar6 = *(uint *)(prim + 2);
    uVar74 = *(uint *)(prim + lVar73 * 4 + 6);
    uVar69 = (ulong)uVar74;
    pGVar72 = (context->scene->geometries).items[uVar6].ptr;
    uVar67 = (ulong)*(uint *)(*(long *)&pGVar72->field_0x58 +
                             uVar69 * pGVar72[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar19 = (pGVar72->time_range).lower;
    fVar19 = pGVar72->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0xe0) - fVar19) / ((pGVar72->time_range).upper - fVar19));
    auVar92 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),9);
    auVar95 = vaddss_avx512f(ZEXT416((uint)pGVar72->fnumTimeSegments),auVar230._0_16_);
    auVar92 = vminss_avx(auVar92,auVar95);
    auVar92 = vmaxss_avx(ZEXT816(0) << 0x20,auVar92);
    fVar19 = fVar19 - auVar92._0_4_;
    _Var9 = pGVar72[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar71 = (long)(int)auVar92._0_4_ * 0x38;
    lVar73 = *(long *)(_Var9 + 0x10 + lVar71);
    lVar70 = *(long *)(_Var9 + 0x38 + lVar71);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar71);
    auVar165._4_4_ = fVar19;
    auVar165._0_4_ = fVar19;
    auVar165._8_4_ = fVar19;
    auVar165._12_4_ = fVar19;
    pfVar3 = (float *)(lVar70 + uVar67 * lVar10);
    auVar219._0_4_ = fVar19 * *pfVar3;
    auVar219._4_4_ = fVar19 * pfVar3[1];
    auVar219._8_4_ = fVar19 * pfVar3[2];
    auVar219._12_4_ = fVar19 * pfVar3[3];
    pfVar3 = (float *)(lVar70 + (uVar67 + 1) * lVar10);
    auVar224._0_4_ = fVar19 * *pfVar3;
    auVar224._4_4_ = fVar19 * pfVar3[1];
    auVar224._8_4_ = fVar19 * pfVar3[2];
    auVar224._12_4_ = fVar19 * pfVar3[3];
    auVar92 = vmulps_avx512vl(auVar165,*(undefined1 (*) [16])(lVar70 + (uVar67 + 2) * lVar10));
    auVar95 = vmulps_avx512vl(auVar165,*(undefined1 (*) [16])(lVar70 + lVar10 * (uVar67 + 3)));
    lVar70 = *(long *)(_Var9 + lVar71);
    fVar19 = 1.0 - fVar19;
    auVar80._4_4_ = fVar19;
    auVar80._0_4_ = fVar19;
    auVar80._8_4_ = fVar19;
    auVar80._12_4_ = fVar19;
    auVar93 = vfmadd231ps_fma(auVar219,auVar80,*(undefined1 (*) [16])(lVar70 + lVar73 * uVar67));
    auVar20 = vfmadd231ps_fma(auVar224,auVar80,
                              *(undefined1 (*) [16])(lVar70 + lVar73 * (uVar67 + 1)));
    auVar90 = vfmadd231ps_avx512vl
                        (auVar92,auVar80,*(undefined1 (*) [16])(lVar70 + lVar73 * (uVar67 + 2)));
    auVar91 = vfmadd231ps_avx512vl
                        (auVar95,auVar80,*(undefined1 (*) [16])(lVar70 + lVar73 * (uVar67 + 3)));
    iVar7 = (int)pGVar72[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar92 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar94 = vsubps_avx(auVar93,auVar92);
    uVar162 = auVar94._0_4_;
    auVar177._4_4_ = uVar162;
    auVar177._0_4_ = uVar162;
    auVar177._8_4_ = uVar162;
    auVar177._12_4_ = uVar162;
    auVar95 = vshufps_avx(auVar94,auVar94,0x55);
    aVar4 = (local_5d0->vx).field_0;
    aVar5 = (local_5d0->vy).field_0;
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    fVar19 = (local_5d0->vz).field_0.m128[0];
    fVar57 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
    fVar58 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
    fVar59 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
    auVar211._0_4_ = fVar19 * auVar94._0_4_;
    auVar211._4_4_ = fVar57 * auVar94._4_4_;
    auVar211._8_4_ = fVar58 * auVar94._8_4_;
    auVar211._12_4_ = fVar59 * auVar94._12_4_;
    auVar95 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar95);
    auVar88 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar177);
    auVar94 = vsubps_avx(auVar20,auVar92);
    uVar162 = auVar94._0_4_;
    auVar178._4_4_ = uVar162;
    auVar178._0_4_ = uVar162;
    auVar178._8_4_ = uVar162;
    auVar178._12_4_ = uVar162;
    auVar95 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar215._0_4_ = fVar19 * auVar94._0_4_;
    auVar215._4_4_ = fVar57 * auVar94._4_4_;
    auVar215._8_4_ = fVar58 * auVar94._8_4_;
    auVar215._12_4_ = fVar59 * auVar94._12_4_;
    auVar95 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar5,auVar95);
    auVar84 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar178);
    auVar94 = vsubps_avx512vl(auVar90,auVar92);
    uVar162 = auVar94._0_4_;
    auVar179._4_4_ = uVar162;
    auVar179._0_4_ = uVar162;
    auVar179._8_4_ = uVar162;
    auVar179._12_4_ = uVar162;
    auVar95 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar218._0_4_ = fVar19 * auVar94._0_4_;
    auVar218._4_4_ = fVar57 * auVar94._4_4_;
    auVar218._8_4_ = fVar58 * auVar94._8_4_;
    auVar218._12_4_ = fVar59 * auVar94._12_4_;
    auVar95 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar95);
    auVar94 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar179);
    auVar95 = vsubps_avx512vl(auVar91,auVar92);
    uVar162 = auVar95._0_4_;
    auVar180._4_4_ = uVar162;
    auVar180._0_4_ = uVar162;
    auVar180._8_4_ = uVar162;
    auVar180._12_4_ = uVar162;
    auVar92 = vshufps_avx(auVar95,auVar95,0x55);
    auVar95 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar221._0_4_ = fVar19 * auVar95._0_4_;
    auVar221._4_4_ = fVar57 * auVar95._4_4_;
    auVar221._8_4_ = fVar58 * auVar95._8_4_;
    auVar221._12_4_ = fVar59 * auVar95._12_4_;
    auVar92 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar92);
    lVar73 = (long)iVar7 * 0x44;
    auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar73);
    auVar85 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar4,auVar180);
    uVar162 = auVar88._0_4_;
    local_460._4_4_ = uVar162;
    local_460._0_4_ = uVar162;
    local_460._8_4_ = uVar162;
    local_460._12_4_ = uVar162;
    local_460._16_4_ = uVar162;
    local_460._20_4_ = uVar162;
    local_460._24_4_ = uVar162;
    local_460._28_4_ = uVar162;
    auVar101._8_4_ = 1;
    auVar101._0_8_ = 0x100000001;
    auVar101._12_4_ = 1;
    auVar101._16_4_ = 1;
    auVar101._20_4_ = 1;
    auVar101._24_4_ = 1;
    auVar101._28_4_ = 1;
    local_480 = vpermps_avx2(auVar101,ZEXT1632(auVar88));
    auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x484);
    uVar162 = auVar84._0_4_;
    auVar181._4_4_ = uVar162;
    auVar181._0_4_ = uVar162;
    auVar181._8_4_ = uVar162;
    auVar181._12_4_ = uVar162;
    local_4a0._16_4_ = uVar162;
    local_4a0._0_16_ = auVar181;
    local_4a0._20_4_ = uVar162;
    local_4a0._24_4_ = uVar162;
    local_4a0._28_4_ = uVar162;
    local_4c0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar84));
    auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x908);
    local_4e0 = vbroadcastss_avx512vl(auVar94);
    auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0xd8c);
    local_500 = vpermps_avx512vl(auVar101,ZEXT1632(auVar94));
    uVar162 = auVar85._0_4_;
    local_520._4_4_ = uVar162;
    local_520._0_4_ = uVar162;
    fStack_518 = (float)uVar162;
    fStack_514 = (float)uVar162;
    fStack_510 = (float)uVar162;
    fStack_50c = (float)uVar162;
    fStack_508 = (float)uVar162;
    register0x0000139c = uVar162;
    _local_540 = vpermps_avx512vl(auVar101,ZEXT1632(auVar85));
    auVar101 = vmulps_avx512vl(_local_520,auVar113);
    auVar102 = vmulps_avx512vl(_local_540,auVar113);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,local_4e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar114,local_500);
    auVar92 = vfmadd231ps_fma(auVar101,auVar116,local_4a0);
    auVar103 = vfmadd231ps_avx512vl(auVar102,auVar116,local_4c0);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar92),auVar115,local_460);
    auVar207 = ZEXT3264(auVar104);
    auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar73);
    auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x484);
    auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x908);
    auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0xd8c);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar115,local_480);
    auVar197 = ZEXT3264(auVar103);
    auVar105 = vmulps_avx512vl(_local_520,auVar111);
    auVar106 = vmulps_avx512vl(_local_540,auVar111);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar112,local_4e0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar112,local_500);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_4a0);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_4c0);
    auVar86 = vfmadd231ps_fma(auVar105,auVar101,local_460);
    auVar209 = ZEXT1664(auVar86);
    auVar87 = vfmadd231ps_fma(auVar106,auVar101,local_480);
    auVar105 = vsubps_avx512vl(ZEXT1632(auVar86),auVar104);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar87),auVar103);
    auVar107 = vmulps_avx512vl(auVar103,auVar105);
    auVar108 = vmulps_avx512vl(auVar104,auVar106);
    auVar107 = vsubps_avx512vl(auVar107,auVar108);
    auVar92 = vshufps_avx(auVar93,auVar93,0xff);
    uVar163 = auVar92._0_8_;
    local_80._8_8_ = uVar163;
    local_80._0_8_ = uVar163;
    local_80._16_8_ = uVar163;
    local_80._24_8_ = uVar163;
    auVar92 = vshufps_avx(auVar20,auVar20,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar92);
    auVar92 = vshufps_avx512vl(auVar90,auVar90,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar92);
    auVar92 = vshufps_avx512vl(auVar91,auVar91,0xff);
    uVar163 = auVar92._0_8_;
    local_e0._8_8_ = uVar163;
    local_e0._0_8_ = uVar163;
    local_e0._16_8_ = uVar163;
    local_e0._24_8_ = uVar163;
    auVar108 = vmulps_avx512vl(local_e0,auVar113);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar114,local_c0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,local_a0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,local_80);
    auVar109 = vmulps_avx512vl(local_e0,auVar111);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_c0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar102,local_a0);
    auVar89 = vfmadd231ps_fma(auVar109,auVar101,local_80);
    auVar109 = vmulps_avx512vl(auVar106,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,auVar105);
    auVar110 = vmaxps_avx512vl(auVar108,ZEXT1632(auVar89));
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar110,auVar109);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    uVar163 = vcmpps_avx512vl(auVar107,auVar109,2);
    auVar92 = vblendps_avx(auVar88,auVar93,8);
    auVar228 = auVar229._0_16_;
    auVar95 = vandps_avx512vl(auVar92,auVar228);
    auVar92 = vblendps_avx(auVar84,auVar20,8);
    auVar92 = vandps_avx512vl(auVar92,auVar228);
    auVar95 = vmaxps_avx(auVar95,auVar92);
    auVar92 = vblendps_avx(auVar94,auVar90,8);
    auVar98 = vandps_avx512vl(auVar92,auVar228);
    auVar92 = vblendps_avx(auVar85,auVar91,8);
    auVar92 = vandps_avx512vl(auVar92,auVar228);
    auVar92 = vmaxps_avx(auVar98,auVar92);
    auVar92 = vmaxps_avx(auVar95,auVar92);
    auVar95 = vmovshdup_avx(auVar92);
    auVar95 = vmaxss_avx(auVar95,auVar92);
    auVar92 = vshufpd_avx(auVar92,auVar92,1);
    auVar92 = vmaxss_avx(auVar92,auVar95);
    auVar95 = vcvtsi2ss_avx512f(auVar228,iVar7);
    local_5c0._0_16_ = auVar95;
    auVar109._0_4_ = auVar95._0_4_;
    auVar109._4_4_ = auVar109._0_4_;
    auVar109._8_4_ = auVar109._0_4_;
    auVar109._12_4_ = auVar109._0_4_;
    auVar109._16_4_ = auVar109._0_4_;
    auVar109._20_4_ = auVar109._0_4_;
    auVar109._24_4_ = auVar109._0_4_;
    auVar109._28_4_ = auVar109._0_4_;
    uVar22 = vcmpps_avx512vl(auVar109,_DAT_01f7b060,0xe);
    bVar75 = (byte)uVar163 & (byte)uVar22;
    local_630 = vmulss_avx512f(auVar92,SUB6416(ZEXT464(0x35000000),0));
    auVar107._8_4_ = 2;
    auVar107._0_8_ = 0x200000002;
    auVar107._12_4_ = 2;
    auVar107._16_4_ = 2;
    auVar107._20_4_ = 2;
    auVar107._24_4_ = 2;
    auVar107._28_4_ = 2;
    local_240 = vpermps_avx2(auVar107,ZEXT1632(auVar88));
    local_260 = vpermps_avx2(auVar107,ZEXT1632(auVar84));
    local_280 = vpermps_avx2(auVar107,ZEXT1632(auVar94));
    local_2a0 = vpermps_avx2(auVar107,ZEXT1632(auVar85));
    local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_55c = 0;
    uStack_558 = 0;
    uStack_554 = 0;
    local_2c0 = vpbroadcastd_avx512vl();
    local_2e0 = vpbroadcastd_avx512vl();
    local_670 = auVar93._0_8_;
    uStack_668 = auVar93._8_8_;
    local_680 = auVar20._0_8_;
    uStack_678 = auVar20._8_8_;
    local_690 = auVar90._0_8_;
    uStack_688 = auVar90._8_8_;
    local_6a0._0_4_ = auVar91._0_4_;
    fVar19 = (float)local_6a0;
    local_6a0._4_4_ = auVar91._4_4_;
    fVar57 = local_6a0._4_4_;
    uStack_698._0_4_ = auVar91._8_4_;
    fVar58 = (float)uStack_698;
    uStack_698._4_4_ = auVar91._12_4_;
    fVar59 = uStack_698._4_4_;
    local_6a0 = auVar91._0_8_;
    uStack_698 = auVar91._8_8_;
    if (bVar75 != 0) {
      auVar111 = vmulps_avx512vl(local_2a0,auVar111);
      auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar111);
      auVar102 = vfmadd213ps_avx512vl(auVar102,local_260,auVar112);
      auVar111 = vfmadd213ps_avx512vl(auVar101,local_240,auVar102);
      auVar113 = vmulps_avx512vl(local_2a0,auVar113);
      auVar114 = vfmadd213ps_avx512vl(auVar114,local_280,auVar113);
      auVar102 = vfmadd213ps_avx512vl(auVar116,local_260,auVar114);
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1210);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1694);
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1b18);
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1f9c);
      auVar107 = vfmadd213ps_avx512vl(auVar115,local_240,auVar102);
      auVar115 = vmulps_avx512vl(_local_520,auVar101);
      auVar102 = vmulps_avx512vl(_local_540,auVar101);
      auVar101 = vmulps_avx512vl(local_2a0,auVar101);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar113,local_4e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar113,local_500);
      auVar113 = vfmadd231ps_avx512vl(auVar101,local_280,auVar113);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar114,local_4a0);
      auVar101 = vfmadd231ps_avx512vl(auVar102,auVar114,local_4c0);
      auVar102 = vfmadd231ps_avx512vl(auVar113,local_260,auVar114);
      auVar92 = vfmadd231ps_fma(auVar115,auVar116,local_460);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar116,local_480);
      auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1210);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1b18);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1f9c);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_240,auVar116);
      auVar116 = vmulps_avx512vl(_local_520,auVar113);
      auVar112 = vmulps_avx512vl(_local_540,auVar113);
      auVar113 = vmulps_avx512vl(local_2a0,auVar113);
      auVar110 = vfmadd231ps_avx512vl(auVar116,auVar114,local_4e0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar114,local_500);
      auVar114 = vfmadd231ps_avx512vl(auVar113,local_280,auVar114);
      auVar229 = ZEXT1664(auVar228);
      auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1694);
      auVar113 = vfmadd231ps_avx512vl(auVar110,auVar116,local_4a0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_4c0);
      auVar116 = vfmadd231ps_avx512vl(auVar114,local_260,auVar116);
      auVar230 = ZEXT1664(auVar230._0_16_);
      auVar95 = vfmadd231ps_fma(auVar113,auVar115,local_460);
      auVar114 = vfmadd231ps_avx512vl(auVar112,auVar115,local_480);
      auVar113 = vfmadd231ps_avx512vl(auVar116,local_240,auVar115);
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
      auVar226._16_4_ = 0x7fffffff;
      auVar226._20_4_ = 0x7fffffff;
      auVar226._24_4_ = 0x7fffffff;
      auVar226._28_4_ = 0x7fffffff;
      auVar115 = vandps_avx(ZEXT1632(auVar92),auVar226);
      auVar116 = vandps_avx(auVar101,auVar226);
      auVar116 = vmaxps_avx(auVar115,auVar116);
      auVar115 = vandps_avx(auVar102,auVar226);
      auVar115 = vmaxps_avx(auVar116,auVar115);
      auVar220._4_4_ = local_630._0_4_;
      auVar220._0_4_ = local_630._0_4_;
      auVar220._8_4_ = local_630._0_4_;
      auVar220._12_4_ = local_630._0_4_;
      auVar220._16_4_ = local_630._0_4_;
      auVar220._20_4_ = local_630._0_4_;
      auVar220._24_4_ = local_630._0_4_;
      auVar220._28_4_ = local_630._0_4_;
      uVar67 = vcmpps_avx512vl(auVar115,auVar220,1);
      bVar12 = (bool)((byte)uVar67 & 1);
      auVar110._0_4_ = (float)((uint)bVar12 * auVar105._0_4_ | (uint)!bVar12 * auVar92._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar92._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar92._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar92._12_4_);
      fVar212 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar105._16_4_);
      auVar110._16_4_ = fVar212;
      fVar168 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar105._20_4_);
      auVar110._20_4_ = fVar168;
      fVar213 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar105._24_4_);
      auVar110._24_4_ = fVar213;
      uVar68 = (uint)(byte)(uVar67 >> 7) * auVar105._28_4_;
      auVar110._28_4_ = uVar68;
      bVar12 = (bool)((byte)uVar67 & 1);
      auVar117._0_4_ = (float)((uint)bVar12 * auVar106._0_4_ | (uint)!bVar12 * auVar101._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar101._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar101._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar101._12_4_);
      bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar101._16_4_);
      bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar101._20_4_);
      bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar101._24_4_);
      bVar12 = SUB81(uVar67 >> 7,0);
      auVar117._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar101._28_4_;
      auVar115 = vandps_avx(auVar226,ZEXT1632(auVar95));
      auVar116 = vandps_avx(auVar114,auVar226);
      auVar116 = vmaxps_avx(auVar115,auVar116);
      auVar115 = vandps_avx(auVar113,auVar226);
      auVar115 = vmaxps_avx(auVar116,auVar115);
      uVar67 = vcmpps_avx512vl(auVar115,auVar220,1);
      bVar12 = (bool)((byte)uVar67 & 1);
      auVar118._0_4_ = (float)((uint)bVar12 * auVar105._0_4_ | (uint)!bVar12 * auVar95._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar95._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar95._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar95._12_4_);
      fVar214 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar105._16_4_);
      auVar118._16_4_ = fVar214;
      fVar167 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar105._20_4_);
      auVar118._20_4_ = fVar167;
      fVar176 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar105._24_4_);
      auVar118._24_4_ = fVar176;
      auVar118._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar105._28_4_;
      bVar12 = (bool)((byte)uVar67 & 1);
      auVar119._0_4_ = (float)((uint)bVar12 * auVar106._0_4_ | (uint)!bVar12 * auVar114._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar119._4_4_ = (float)((uint)bVar12 * auVar106._4_4_ | (uint)!bVar12 * auVar114._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar119._8_4_ = (float)((uint)bVar12 * auVar106._8_4_ | (uint)!bVar12 * auVar114._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar119._12_4_ = (float)((uint)bVar12 * auVar106._12_4_ | (uint)!bVar12 * auVar114._12_4_);
      bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar119._16_4_ = (float)((uint)bVar12 * auVar106._16_4_ | (uint)!bVar12 * auVar114._16_4_);
      bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar119._20_4_ = (float)((uint)bVar12 * auVar106._20_4_ | (uint)!bVar12 * auVar114._20_4_);
      bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar119._24_4_ = (float)((uint)bVar12 * auVar106._24_4_ | (uint)!bVar12 * auVar114._24_4_);
      bVar12 = SUB81(uVar67 >> 7,0);
      auVar119._28_4_ = (uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar114._28_4_;
      auVar99 = vxorps_avx512vl(auVar181,auVar181);
      auVar115 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar99));
      auVar92 = vfmadd231ps_fma(auVar115,auVar117,auVar117);
      auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
      fVar77 = auVar114._0_4_;
      fVar78 = auVar114._4_4_;
      fVar141 = auVar114._8_4_;
      fVar142 = auVar114._12_4_;
      fVar143 = auVar114._16_4_;
      fVar144 = auVar114._20_4_;
      fVar146 = auVar114._24_4_;
      auVar115._4_4_ = fVar78 * fVar78 * fVar78 * auVar92._4_4_ * -0.5;
      auVar115._0_4_ = fVar77 * fVar77 * fVar77 * auVar92._0_4_ * -0.5;
      auVar115._8_4_ = fVar141 * fVar141 * fVar141 * auVar92._8_4_ * -0.5;
      auVar115._12_4_ = fVar142 * fVar142 * fVar142 * auVar92._12_4_ * -0.5;
      auVar115._16_4_ = fVar143 * fVar143 * fVar143 * -0.0;
      auVar115._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
      auVar115._24_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar115._28_4_ = 0;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar101,auVar114);
      auVar116._4_4_ = auVar117._4_4_ * auVar115._4_4_;
      auVar116._0_4_ = auVar117._0_4_ * auVar115._0_4_;
      auVar116._8_4_ = auVar117._8_4_ * auVar115._8_4_;
      auVar116._12_4_ = auVar117._12_4_ * auVar115._12_4_;
      auVar116._16_4_ = auVar117._16_4_ * auVar115._16_4_;
      auVar116._20_4_ = auVar117._20_4_ * auVar115._20_4_;
      auVar116._24_4_ = auVar117._24_4_ * auVar115._24_4_;
      auVar116._28_4_ = auVar114._28_4_;
      auVar114._4_4_ = auVar115._4_4_ * -auVar110._4_4_;
      auVar114._0_4_ = auVar115._0_4_ * -auVar110._0_4_;
      auVar114._8_4_ = auVar115._8_4_ * -auVar110._8_4_;
      auVar114._12_4_ = auVar115._12_4_ * -auVar110._12_4_;
      auVar114._16_4_ = auVar115._16_4_ * -fVar212;
      auVar114._20_4_ = auVar115._20_4_ * -fVar168;
      auVar114._24_4_ = auVar115._24_4_ * -fVar213;
      auVar114._28_4_ = uVar68 ^ 0x80000000;
      auVar105 = vmulps_avx512vl(auVar115,ZEXT1632(auVar99));
      auVar106 = ZEXT1632(auVar99);
      auVar113 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar106);
      auVar92 = vfmadd231ps_fma(auVar113,auVar119,auVar119);
      auVar112 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
      fVar168 = auVar112._0_4_;
      fVar212 = auVar112._4_4_;
      fVar213 = auVar112._8_4_;
      fVar77 = auVar112._12_4_;
      fVar78 = auVar112._16_4_;
      fVar141 = auVar112._20_4_;
      fVar142 = auVar112._24_4_;
      auVar113._4_4_ = fVar212 * fVar212 * fVar212 * auVar92._4_4_ * -0.5;
      auVar113._0_4_ = fVar168 * fVar168 * fVar168 * auVar92._0_4_ * -0.5;
      auVar113._8_4_ = fVar213 * fVar213 * fVar213 * auVar92._8_4_ * -0.5;
      auVar113._12_4_ = fVar77 * fVar77 * fVar77 * auVar92._12_4_ * -0.5;
      auVar113._16_4_ = fVar78 * fVar78 * fVar78 * -0.0;
      auVar113._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar113._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar113._28_4_ = 0;
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar101,auVar112);
      auVar102._4_4_ = auVar119._4_4_ * auVar113._4_4_;
      auVar102._0_4_ = auVar119._0_4_ * auVar113._0_4_;
      auVar102._8_4_ = auVar119._8_4_ * auVar113._8_4_;
      auVar102._12_4_ = auVar119._12_4_ * auVar113._12_4_;
      auVar102._16_4_ = auVar119._16_4_ * auVar113._16_4_;
      auVar102._20_4_ = auVar119._20_4_ * auVar113._20_4_;
      auVar102._24_4_ = auVar119._24_4_ * auVar113._24_4_;
      auVar102._28_4_ = auVar112._28_4_;
      auVar112._4_4_ = -auVar118._4_4_ * auVar113._4_4_;
      auVar112._0_4_ = -auVar118._0_4_ * auVar113._0_4_;
      auVar112._8_4_ = -auVar118._8_4_ * auVar113._8_4_;
      auVar112._12_4_ = -auVar118._12_4_ * auVar113._12_4_;
      auVar112._16_4_ = -fVar214 * auVar113._16_4_;
      auVar112._20_4_ = -fVar167 * auVar113._20_4_;
      auVar112._24_4_ = -fVar176 * auVar113._24_4_;
      auVar112._28_4_ = auVar115._28_4_;
      auVar115 = vmulps_avx512vl(auVar113,auVar106);
      auVar92 = vfmadd213ps_fma(auVar116,auVar108,auVar104);
      auVar95 = vfmadd213ps_fma(auVar114,auVar108,auVar103);
      auVar113 = vfmadd213ps_avx512vl(auVar105,auVar108,auVar107);
      auVar101 = vfmadd213ps_avx512vl(auVar102,ZEXT1632(auVar89),ZEXT1632(auVar86));
      auVar91 = vfnmadd213ps_fma(auVar116,auVar108,auVar104);
      auVar104 = ZEXT1632(auVar89);
      auVar94 = vfmadd213ps_fma(auVar112,auVar104,ZEXT1632(auVar87));
      auVar98 = vfnmadd213ps_fma(auVar114,auVar108,auVar103);
      auVar88 = vfmadd213ps_fma(auVar115,auVar104,auVar111);
      auVar116 = vfnmadd231ps_avx512vl(auVar107,auVar108,auVar105);
      auVar86 = vfnmadd213ps_fma(auVar102,auVar104,ZEXT1632(auVar86));
      auVar87 = vfnmadd213ps_fma(auVar112,auVar104,ZEXT1632(auVar87));
      auVar228 = vfnmadd231ps_fma(auVar111,ZEXT1632(auVar89),auVar115);
      auVar114 = vsubps_avx512vl(auVar101,ZEXT1632(auVar91));
      auVar115 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar98));
      auVar102 = vsubps_avx512vl(ZEXT1632(auVar88),auVar116);
      auVar112 = vmulps_avx512vl(auVar115,auVar116);
      auVar84 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar98),auVar102);
      auVar111._4_4_ = auVar91._4_4_ * auVar102._4_4_;
      auVar111._0_4_ = auVar91._0_4_ * auVar102._0_4_;
      auVar111._8_4_ = auVar91._8_4_ * auVar102._8_4_;
      auVar111._12_4_ = auVar91._12_4_ * auVar102._12_4_;
      auVar111._16_4_ = auVar102._16_4_ * 0.0;
      auVar111._20_4_ = auVar102._20_4_ * 0.0;
      auVar111._24_4_ = auVar102._24_4_ * 0.0;
      auVar111._28_4_ = auVar102._28_4_;
      auVar102 = vfmsub231ps_avx512vl(auVar111,auVar116,auVar114);
      auVar103._4_4_ = auVar98._4_4_ * auVar114._4_4_;
      auVar103._0_4_ = auVar98._0_4_ * auVar114._0_4_;
      auVar103._8_4_ = auVar98._8_4_ * auVar114._8_4_;
      auVar103._12_4_ = auVar98._12_4_ * auVar114._12_4_;
      auVar103._16_4_ = auVar114._16_4_ * 0.0;
      auVar103._20_4_ = auVar114._20_4_ * 0.0;
      auVar103._24_4_ = auVar114._24_4_ * 0.0;
      auVar103._28_4_ = auVar114._28_4_;
      auVar85 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar91),auVar115);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar106,auVar102);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,ZEXT1632(auVar84));
      auVar107 = ZEXT1632(auVar99);
      uVar67 = vcmpps_avx512vl(auVar115,auVar107,2);
      bVar66 = (byte)uVar67;
      fVar77 = (float)((uint)(bVar66 & 1) * auVar92._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar86._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      fVar141 = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar86._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      fVar143 = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar86._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      fVar146 = (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar86._12_4_);
      auVar112 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar77))));
      fVar78 = (float)((uint)(bVar66 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar87._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      fVar142 = (float)((uint)bVar12 * auVar95._4_4_ | (uint)!bVar12 * auVar87._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      fVar144 = (float)((uint)bVar12 * auVar95._8_4_ | (uint)!bVar12 * auVar87._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      fVar147 = (float)((uint)bVar12 * auVar95._12_4_ | (uint)!bVar12 * auVar87._12_4_);
      auVar111 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar144,CONCAT44(fVar142,fVar78))));
      auVar120._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar228._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar228._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar228._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar228._12_4_);
      fVar168 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar113._16_4_);
      auVar120._16_4_ = fVar168;
      fVar212 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar113._20_4_);
      auVar120._20_4_ = fVar212;
      fVar213 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar113._24_4_);
      auVar120._24_4_ = fVar213;
      iVar1 = (uint)(byte)(uVar67 >> 7) * auVar113._28_4_;
      auVar120._28_4_ = iVar1;
      auVar114 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar101);
      auVar121._0_4_ =
           (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar95._0_4_;
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar95._4_4_;
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar95._8_4_;
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar95._12_4_;
      auVar121._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar114._16_4_;
      auVar121._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar114._20_4_;
      auVar121._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar114._24_4_;
      auVar121._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar114._28_4_;
      auVar114 = vblendmps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar94));
      auVar122._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar84._0_4_);
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar122._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar84._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar122._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar84._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar122._12_4_ = (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar84._12_4_);
      fVar176 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar114._16_4_);
      auVar122._16_4_ = fVar176;
      fVar167 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar114._20_4_);
      auVar122._20_4_ = fVar167;
      fVar214 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar114._24_4_);
      auVar122._24_4_ = fVar214;
      auVar122._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar114._28_4_;
      auVar114 = vblendmps_avx512vl(auVar116,ZEXT1632(auVar88));
      auVar123._0_4_ =
           (float)((uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar113._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar113._4_4_);
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar113._8_4_);
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar113._12_4_);
      bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar123._16_4_ = (float)((uint)bVar12 * auVar114._16_4_ | (uint)!bVar12 * auVar113._16_4_);
      bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar123._20_4_ = (float)((uint)bVar12 * auVar114._20_4_ | (uint)!bVar12 * auVar113._20_4_);
      bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar123._24_4_ = (float)((uint)bVar12 * auVar114._24_4_ | (uint)!bVar12 * auVar113._24_4_);
      bVar12 = SUB81(uVar67 >> 7,0);
      auVar123._28_4_ = (uint)bVar12 * auVar114._28_4_ | (uint)!bVar12 * auVar113._28_4_;
      auVar124._0_4_ =
           (uint)(bVar66 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar101._0_4_;
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar12 * (int)auVar91._4_4_ | (uint)!bVar12 * auVar101._4_4_;
      bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar12 * (int)auVar91._8_4_ | (uint)!bVar12 * auVar101._8_4_;
      bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar12 * (int)auVar91._12_4_ | (uint)!bVar12 * auVar101._12_4_;
      auVar124._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar101._16_4_;
      auVar124._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar101._20_4_;
      auVar124._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar101._24_4_;
      auVar124._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar101._28_4_;
      bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar125._0_4_ =
           (uint)(bVar66 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar88._0_4_;
      bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar88._4_4_;
      bVar13 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar88._8_4_;
      bVar13 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar88._12_4_;
      auVar125._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar116._16_4_;
      auVar125._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar116._20_4_;
      auVar125._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar116._24_4_;
      iVar2 = (uint)(byte)(uVar67 >> 7) * auVar116._28_4_;
      auVar125._28_4_ = iVar2;
      auVar103 = vsubps_avx512vl(auVar124,auVar112);
      auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar98._12_4_ |
                                               (uint)!bVar15 * auVar94._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar98._8_4_ |
                                                        (uint)!bVar14 * auVar94._8_4_,
                                                        CONCAT44((uint)bVar12 * (int)auVar98._4_4_ |
                                                                 (uint)!bVar12 * auVar94._4_4_,
                                                                 (uint)(bVar66 & 1) *
                                                                 (int)auVar98._0_4_ |
                                                                 (uint)!(bool)(bVar66 & 1) *
                                                                 auVar94._0_4_)))),auVar111);
      auVar207 = ZEXT3264(auVar116);
      auVar114 = vsubps_avx(auVar125,auVar120);
      auVar113 = vsubps_avx(auVar112,auVar121);
      auVar209 = ZEXT3264(auVar113);
      auVar101 = vsubps_avx(auVar111,auVar122);
      auVar102 = vsubps_avx(auVar120,auVar123);
      auVar104._4_4_ = auVar114._4_4_ * fVar141;
      auVar104._0_4_ = auVar114._0_4_ * fVar77;
      auVar104._8_4_ = auVar114._8_4_ * fVar143;
      auVar104._12_4_ = auVar114._12_4_ * fVar146;
      auVar104._16_4_ = auVar114._16_4_ * 0.0;
      auVar104._20_4_ = auVar114._20_4_ * 0.0;
      auVar104._24_4_ = auVar114._24_4_ * 0.0;
      auVar104._28_4_ = iVar2;
      auVar92 = vfmsub231ps_fma(auVar104,auVar120,auVar103);
      auVar105._4_4_ = fVar142 * auVar103._4_4_;
      auVar105._0_4_ = fVar78 * auVar103._0_4_;
      auVar105._8_4_ = fVar144 * auVar103._8_4_;
      auVar105._12_4_ = fVar147 * auVar103._12_4_;
      auVar105._16_4_ = auVar103._16_4_ * 0.0;
      auVar105._20_4_ = auVar103._20_4_ * 0.0;
      auVar105._24_4_ = auVar103._24_4_ * 0.0;
      auVar105._28_4_ = auVar115._28_4_;
      auVar95 = vfmsub231ps_fma(auVar105,auVar112,auVar116);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar107,ZEXT1632(auVar92));
      auVar191._0_4_ = auVar116._0_4_ * auVar120._0_4_;
      auVar191._4_4_ = auVar116._4_4_ * auVar120._4_4_;
      auVar191._8_4_ = auVar116._8_4_ * auVar120._8_4_;
      auVar191._12_4_ = auVar116._12_4_ * auVar120._12_4_;
      auVar191._16_4_ = auVar116._16_4_ * fVar168;
      auVar191._20_4_ = auVar116._20_4_ * fVar212;
      auVar191._24_4_ = auVar116._24_4_ * fVar213;
      auVar191._28_4_ = 0;
      auVar92 = vfmsub231ps_fma(auVar191,auVar111,auVar114);
      auVar104 = vfmadd231ps_avx512vl(auVar115,auVar107,ZEXT1632(auVar92));
      auVar115 = vmulps_avx512vl(auVar102,auVar121);
      auVar115 = vfmsub231ps_avx512vl(auVar115,auVar113,auVar123);
      auVar106._4_4_ = auVar101._4_4_ * auVar123._4_4_;
      auVar106._0_4_ = auVar101._0_4_ * auVar123._0_4_;
      auVar106._8_4_ = auVar101._8_4_ * auVar123._8_4_;
      auVar106._12_4_ = auVar101._12_4_ * auVar123._12_4_;
      auVar106._16_4_ = auVar101._16_4_ * auVar123._16_4_;
      auVar106._20_4_ = auVar101._20_4_ * auVar123._20_4_;
      auVar106._24_4_ = auVar101._24_4_ * auVar123._24_4_;
      auVar106._28_4_ = auVar123._28_4_;
      auVar92 = vfmsub231ps_fma(auVar106,auVar122,auVar102);
      auVar192._0_4_ = auVar122._0_4_ * auVar113._0_4_;
      auVar192._4_4_ = auVar122._4_4_ * auVar113._4_4_;
      auVar192._8_4_ = auVar122._8_4_ * auVar113._8_4_;
      auVar192._12_4_ = auVar122._12_4_ * auVar113._12_4_;
      auVar192._16_4_ = fVar176 * auVar113._16_4_;
      auVar192._20_4_ = fVar167 * auVar113._20_4_;
      auVar192._24_4_ = fVar214 * auVar113._24_4_;
      auVar192._28_4_ = 0;
      auVar95 = vfmsub231ps_fma(auVar192,auVar101,auVar121);
      auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar107,auVar115);
      auVar105 = vfmadd231ps_avx512vl(auVar115,auVar107,ZEXT1632(auVar92));
      auVar197 = ZEXT3264(auVar105);
      auVar115 = vmaxps_avx(auVar104,auVar105);
      uVar163 = vcmpps_avx512vl(auVar115,auVar107,2);
      bVar75 = bVar75 & (byte)uVar163;
      if (bVar75 != 0) {
        auVar32._4_4_ = auVar102._4_4_ * auVar116._4_4_;
        auVar32._0_4_ = auVar102._0_4_ * auVar116._0_4_;
        auVar32._8_4_ = auVar102._8_4_ * auVar116._8_4_;
        auVar32._12_4_ = auVar102._12_4_ * auVar116._12_4_;
        auVar32._16_4_ = auVar102._16_4_ * auVar116._16_4_;
        auVar32._20_4_ = auVar102._20_4_ * auVar116._20_4_;
        auVar32._24_4_ = auVar102._24_4_ * auVar116._24_4_;
        auVar32._28_4_ = auVar115._28_4_;
        auVar88 = vfmsub231ps_fma(auVar32,auVar101,auVar114);
        auVar33._4_4_ = auVar114._4_4_ * auVar113._4_4_;
        auVar33._0_4_ = auVar114._0_4_ * auVar113._0_4_;
        auVar33._8_4_ = auVar114._8_4_ * auVar113._8_4_;
        auVar33._12_4_ = auVar114._12_4_ * auVar113._12_4_;
        auVar33._16_4_ = auVar114._16_4_ * auVar113._16_4_;
        auVar33._20_4_ = auVar114._20_4_ * auVar113._20_4_;
        auVar33._24_4_ = auVar114._24_4_ * auVar113._24_4_;
        auVar33._28_4_ = auVar114._28_4_;
        auVar94 = vfmsub231ps_fma(auVar33,auVar103,auVar102);
        auVar34._4_4_ = auVar101._4_4_ * auVar103._4_4_;
        auVar34._0_4_ = auVar101._0_4_ * auVar103._0_4_;
        auVar34._8_4_ = auVar101._8_4_ * auVar103._8_4_;
        auVar34._12_4_ = auVar101._12_4_ * auVar103._12_4_;
        auVar34._16_4_ = auVar101._16_4_ * auVar103._16_4_;
        auVar34._20_4_ = auVar101._20_4_ * auVar103._20_4_;
        auVar34._24_4_ = auVar101._24_4_ * auVar103._24_4_;
        auVar34._28_4_ = auVar101._28_4_;
        auVar84 = vfmsub231ps_fma(auVar34,auVar113,auVar116);
        auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar84));
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar88),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar95));
        auVar25._8_4_ = 0x3f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._12_4_ = 0x3f800000;
        auVar25._16_4_ = 0x3f800000;
        auVar25._20_4_ = 0x3f800000;
        auVar25._24_4_ = 0x3f800000;
        auVar25._28_4_ = 0x3f800000;
        auVar116 = vfnmadd213ps_avx512vl(auVar115,ZEXT1632(auVar95),auVar25);
        auVar92 = vfmadd132ps_fma(auVar116,auVar115,auVar115);
        auVar207 = ZEXT1664(auVar92);
        auVar35._4_4_ = auVar84._4_4_ * auVar120._4_4_;
        auVar35._0_4_ = auVar84._0_4_ * auVar120._0_4_;
        auVar35._8_4_ = auVar84._8_4_ * auVar120._8_4_;
        auVar35._12_4_ = auVar84._12_4_ * auVar120._12_4_;
        auVar35._16_4_ = fVar168 * 0.0;
        auVar35._20_4_ = fVar212 * 0.0;
        auVar35._24_4_ = fVar213 * 0.0;
        auVar35._28_4_ = iVar1;
        auVar94 = vfmadd231ps_fma(auVar35,auVar111,ZEXT1632(auVar94));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar112,ZEXT1632(auVar88));
        fVar168 = auVar92._0_4_;
        fVar212 = auVar92._4_4_;
        fVar213 = auVar92._8_4_;
        fVar214 = auVar92._12_4_;
        local_5a0._28_4_ = auVar115._28_4_;
        local_5a0._0_28_ =
             ZEXT1628(CONCAT412(auVar94._12_4_ * fVar214,
                                CONCAT48(auVar94._8_4_ * fVar213,
                                         CONCAT44(auVar94._4_4_ * fVar212,auVar94._0_4_ * fVar168)))
                     );
        auVar209 = ZEXT3264(local_5a0);
        auVar154._4_4_ = local_560;
        auVar154._0_4_ = local_560;
        auVar154._8_4_ = local_560;
        auVar154._12_4_ = local_560;
        auVar154._16_4_ = local_560;
        auVar154._20_4_ = local_560;
        auVar154._24_4_ = local_560;
        auVar154._28_4_ = local_560;
        uVar163 = vcmpps_avx512vl(auVar154,local_5a0,2);
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar26._4_4_ = uVar162;
        auVar26._0_4_ = uVar162;
        auVar26._8_4_ = uVar162;
        auVar26._12_4_ = uVar162;
        auVar26._16_4_ = uVar162;
        auVar26._20_4_ = uVar162;
        auVar26._24_4_ = uVar162;
        auVar26._28_4_ = uVar162;
        uVar22 = vcmpps_avx512vl(local_5a0,auVar26,2);
        bVar75 = (byte)uVar163 & (byte)uVar22 & bVar75;
        if (bVar75 != 0) {
          uVar76 = vcmpps_avx512vl(ZEXT1632(auVar95),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar76 = bVar75 & uVar76;
          if ((char)uVar76 != '\0') {
            fVar167 = auVar104._0_4_ * fVar168;
            fVar176 = auVar104._4_4_ * fVar212;
            auVar36._4_4_ = fVar176;
            auVar36._0_4_ = fVar167;
            fVar77 = auVar104._8_4_ * fVar213;
            auVar36._8_4_ = fVar77;
            fVar78 = auVar104._12_4_ * fVar214;
            auVar36._12_4_ = fVar78;
            fVar141 = auVar104._16_4_ * 0.0;
            auVar36._16_4_ = fVar141;
            fVar142 = auVar104._20_4_ * 0.0;
            auVar36._20_4_ = fVar142;
            fVar143 = auVar104._24_4_ * 0.0;
            auVar36._24_4_ = fVar143;
            auVar36._28_4_ = auVar104._28_4_;
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = 0x3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            auVar115 = vsubps_avx(auVar155,auVar36);
            local_440._0_4_ =
                 (float)((uint)(bVar66 & 1) * (int)fVar167 |
                        (uint)!(bool)(bVar66 & 1) * auVar115._0_4_);
            bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
            local_440._4_4_ = (float)((uint)bVar12 * (int)fVar176 | (uint)!bVar12 * auVar115._4_4_);
            bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
            local_440._8_4_ = (float)((uint)bVar12 * (int)fVar77 | (uint)!bVar12 * auVar115._8_4_);
            bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
            local_440._12_4_ = (float)((uint)bVar12 * (int)fVar78 | (uint)!bVar12 * auVar115._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
            local_440._16_4_ =
                 (float)((uint)bVar12 * (int)fVar141 | (uint)!bVar12 * auVar115._16_4_);
            bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
            local_440._20_4_ =
                 (float)((uint)bVar12 * (int)fVar142 | (uint)!bVar12 * auVar115._20_4_);
            bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
            local_440._24_4_ =
                 (float)((uint)bVar12 * (int)fVar143 | (uint)!bVar12 * auVar115._24_4_);
            bVar12 = SUB81(uVar67 >> 7,0);
            local_440._28_4_ =
                 (float)((uint)bVar12 * auVar104._28_4_ | (uint)!bVar12 * auVar115._28_4_);
            auVar115 = vsubps_avx(ZEXT1632(auVar89),auVar108);
            auVar92 = vfmadd213ps_fma(auVar115,local_440,auVar108);
            uVar162 = *(undefined4 *)((long)local_608->ray_space + k * 4 + -0x20);
            auVar108._4_4_ = uVar162;
            auVar108._0_4_ = uVar162;
            auVar108._8_4_ = uVar162;
            auVar108._12_4_ = uVar162;
            auVar108._16_4_ = uVar162;
            auVar108._20_4_ = uVar162;
            auVar108._24_4_ = uVar162;
            auVar108._28_4_ = uVar162;
            auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                          CONCAT48(auVar92._8_4_ + auVar92._8_4_,
                                                                   CONCAT44(auVar92._4_4_ +
                                                                            auVar92._4_4_,
                                                                            auVar92._0_4_ +
                                                                            auVar92._0_4_)))),
                                       auVar108);
            uVar21 = vcmpps_avx512vl(local_5a0,auVar115,6);
            uVar76 = uVar76 & uVar21;
            bVar75 = (byte)uVar76;
            if (bVar75 != 0) {
              auVar174._0_4_ = auVar105._0_4_ * fVar168;
              auVar174._4_4_ = auVar105._4_4_ * fVar212;
              auVar174._8_4_ = auVar105._8_4_ * fVar213;
              auVar174._12_4_ = auVar105._12_4_ * fVar214;
              auVar174._16_4_ = auVar105._16_4_ * 0.0;
              auVar174._20_4_ = auVar105._20_4_ * 0.0;
              auVar174._24_4_ = auVar105._24_4_ * 0.0;
              auVar174._28_4_ = 0;
              auVar186._8_4_ = 0x3f800000;
              auVar186._0_8_ = 0x3f8000003f800000;
              auVar186._12_4_ = 0x3f800000;
              auVar186._16_4_ = 0x3f800000;
              auVar186._20_4_ = 0x3f800000;
              auVar186._24_4_ = 0x3f800000;
              auVar186._28_4_ = 0x3f800000;
              auVar115 = vsubps_avx(auVar186,auVar174);
              auVar126._0_4_ =
                   (uint)(bVar66 & 1) * (int)auVar174._0_4_ |
                   (uint)!(bool)(bVar66 & 1) * auVar115._0_4_;
              bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
              auVar126._4_4_ = (uint)bVar12 * (int)auVar174._4_4_ | (uint)!bVar12 * auVar115._4_4_;
              bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
              auVar126._8_4_ = (uint)bVar12 * (int)auVar174._8_4_ | (uint)!bVar12 * auVar115._8_4_;
              bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
              auVar126._12_4_ =
                   (uint)bVar12 * (int)auVar174._12_4_ | (uint)!bVar12 * auVar115._12_4_;
              bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
              auVar126._16_4_ =
                   (uint)bVar12 * (int)auVar174._16_4_ | (uint)!bVar12 * auVar115._16_4_;
              bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
              auVar126._20_4_ =
                   (uint)bVar12 * (int)auVar174._20_4_ | (uint)!bVar12 * auVar115._20_4_;
              bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
              auVar126._24_4_ =
                   (uint)bVar12 * (int)auVar174._24_4_ | (uint)!bVar12 * auVar115._24_4_;
              auVar126._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar115._28_4_;
              auVar27._8_4_ = 0x40000000;
              auVar27._0_8_ = 0x4000000040000000;
              auVar27._12_4_ = 0x40000000;
              auVar27._16_4_ = 0x40000000;
              auVar27._20_4_ = 0x40000000;
              auVar27._24_4_ = 0x40000000;
              auVar27._28_4_ = 0x40000000;
              local_420 = vfmsub132ps_avx512vl(auVar126,auVar186,auVar27);
              local_3e0 = 0;
              local_3d0 = local_670;
              uStack_3c8 = uStack_668;
              local_3c0 = local_680;
              uStack_3b8 = uStack_678;
              local_3b0 = local_690;
              uStack_3a8 = uStack_688;
              local_3a0 = local_6a0;
              uStack_398 = uStack_698;
              if ((pGVar72->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar168 = 1.0 / auVar109._0_4_;
                local_380[0] = fVar168 * (local_440._0_4_ + 0.0);
                local_380[1] = fVar168 * (local_440._4_4_ + 1.0);
                local_380[2] = fVar168 * (local_440._8_4_ + 2.0);
                local_380[3] = fVar168 * (local_440._12_4_ + 3.0);
                fStack_370 = fVar168 * (local_440._16_4_ + 4.0);
                fStack_36c = fVar168 * (local_440._20_4_ + 5.0);
                fStack_368 = fVar168 * (local_440._24_4_ + 6.0);
                fStack_364 = local_440._28_4_ + 7.0;
                local_360 = local_420;
                local_340 = local_5a0;
                auVar156._8_4_ = 0x7f800000;
                auVar156._0_8_ = 0x7f8000007f800000;
                auVar156._12_4_ = 0x7f800000;
                auVar156._16_4_ = 0x7f800000;
                auVar156._20_4_ = 0x7f800000;
                auVar156._24_4_ = 0x7f800000;
                auVar156._28_4_ = 0x7f800000;
                auVar115 = vblendmps_avx512vl(auVar156,local_5a0);
                auVar127._0_4_ =
                     (uint)(bVar75 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar75 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
                auVar127._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                auVar127._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                auVar127._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
                auVar127._16_4_ = (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
                auVar127._20_4_ = (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
                auVar127._24_4_ = (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar76 >> 7,0);
                auVar127._28_4_ = (uint)bVar12 * auVar115._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar115 = vshufps_avx(auVar127,auVar127,0xb1);
                auVar115 = vminps_avx(auVar127,auVar115);
                auVar116 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar116);
                auVar116 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar116);
                uVar163 = vcmpps_avx512vl(auVar127,auVar115,0);
                uVar68 = (uint)uVar76;
                if ((bVar75 & (byte)uVar163) != 0) {
                  uVar68 = (uint)(bVar75 & (byte)uVar163);
                }
                uVar23 = 0;
                for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                  uVar23 = uVar23 + 1;
                }
                uVar67 = (ulong)uVar23;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar72->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_580._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                  local_400 = local_5a0;
                  local_3dc = iVar7;
                  do {
                    local_1c0 = local_380[uVar67];
                    local_1a0 = *(undefined4 *)(local_360 + uVar67 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar67 * 4);
                    local_660.context = context->user;
                    fVar212 = 1.0 - local_1c0;
                    fVar168 = fVar212 * fVar212 * -3.0;
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar212)),
                                              ZEXT416((uint)(local_1c0 * fVar212)),
                                              ZEXT416(0xc0000000));
                    auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar212)),
                                              ZEXT416((uint)(local_1c0 * local_1c0)),
                                              ZEXT416(0x40000000));
                    fVar212 = auVar92._0_4_ * 3.0;
                    fVar213 = auVar95._0_4_ * 3.0;
                    fVar214 = local_1c0 * local_1c0 * 3.0;
                    auVar203._0_4_ = fVar214 * fVar19;
                    auVar203._4_4_ = fVar214 * fVar57;
                    auVar203._8_4_ = fVar214 * fVar58;
                    auVar203._12_4_ = fVar214 * fVar59;
                    auVar152._4_4_ = fVar213;
                    auVar152._0_4_ = fVar213;
                    auVar152._8_4_ = fVar213;
                    auVar152._12_4_ = fVar213;
                    auVar92 = vfmadd132ps_fma(auVar152,auVar203,auVar90);
                    auVar185._4_4_ = fVar212;
                    auVar185._0_4_ = fVar212;
                    auVar185._8_4_ = fVar212;
                    auVar185._12_4_ = fVar212;
                    auVar92 = vfmadd132ps_fma(auVar185,auVar92,auVar20);
                    auVar153._4_4_ = fVar168;
                    auVar153._0_4_ = fVar168;
                    auVar153._8_4_ = fVar168;
                    auVar153._12_4_ = fVar168;
                    auVar92 = vfmadd132ps_fma(auVar153,auVar92,auVar93);
                    local_220 = auVar92._0_4_;
                    auVar196._8_4_ = 1;
                    auVar196._0_8_ = 0x100000001;
                    auVar196._12_4_ = 1;
                    auVar196._16_4_ = 1;
                    auVar196._20_4_ = 1;
                    auVar196._24_4_ = 1;
                    auVar196._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar196,ZEXT1632(auVar92));
                    auVar197 = ZEXT3264(local_200);
                    auVar204._8_4_ = 2;
                    auVar204._0_8_ = 0x200000002;
                    auVar204._12_4_ = 2;
                    auVar206._16_4_ = 2;
                    auVar206._0_16_ = auVar204;
                    auVar206._20_4_ = 2;
                    auVar206._24_4_ = 2;
                    auVar206._28_4_ = 2;
                    auVar207 = ZEXT3264(auVar206);
                    local_1e0 = vpermps_avx2(auVar206,ZEXT1632(auVar92));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2e0._0_8_;
                    uStack_178 = local_2e0._8_8_;
                    uStack_170 = local_2e0._16_8_;
                    uStack_168 = local_2e0._24_8_;
                    local_160 = local_2c0;
                    auVar115 = vpcmpeqd_avx2(local_2c0,local_2c0);
                    local_610[1] = auVar115;
                    *local_610 = auVar115;
                    local_140 = (local_660.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_660.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_600 = local_300;
                    local_660.valid = (int *)local_600;
                    local_660.geometryUserPtr = pGVar72->userPtr;
                    local_660.hit = (RTCHitN *)&local_220;
                    local_660.N = 8;
                    local_660.ray = (RTCRayN *)ray;
                    if (pGVar72->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar197 = ZEXT1664(local_200._0_16_);
                      auVar207 = ZEXT1664(auVar204);
                      (*pGVar72->intersectionFilterN)(&local_660);
                      auVar209 = ZEXT3264(local_5a0);
                      auVar230 = ZEXT464(0xbf800000);
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar229 = ZEXT1664(auVar92);
                    }
                    if (local_600 == (undefined1  [32])0x0) {
LAB_018b19b1:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_580._0_4_;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar72->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar197 = ZEXT1664(auVar197._0_16_);
                        auVar207 = ZEXT1664(auVar207._0_16_);
                        (*p_Var11)(&local_660);
                        auVar209 = ZEXT3264(local_5a0);
                        auVar230 = ZEXT464(0xbf800000);
                        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar229 = ZEXT1664(auVar92);
                      }
                      if (local_600 == (undefined1  [32])0x0) goto LAB_018b19b1;
                      uVar21 = vptestmd_avx512vl(local_600,local_600);
                      iVar1 = *(int *)(local_660.hit + 4);
                      iVar2 = *(int *)(local_660.hit + 8);
                      iVar60 = *(int *)(local_660.hit + 0xc);
                      iVar61 = *(int *)(local_660.hit + 0x10);
                      iVar62 = *(int *)(local_660.hit + 0x14);
                      iVar63 = *(int *)(local_660.hit + 0x18);
                      iVar64 = *(int *)(local_660.hit + 0x1c);
                      bVar75 = (byte)uVar21;
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_660.ray + 0x180) =
                           (uint)(bVar75 & 1) * *(int *)local_660.hit |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x180);
                      *(uint *)(local_660.ray + 0x184) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_660.ray + 0x184);
                      *(uint *)(local_660.ray + 0x188) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_660.ray + 0x188);
                      *(uint *)(local_660.ray + 0x18c) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_660.ray + 0x18c);
                      *(uint *)(local_660.ray + 400) =
                           (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_660.ray + 400);
                      *(uint *)(local_660.ray + 0x194) =
                           (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_660.ray + 0x194);
                      *(uint *)(local_660.ray + 0x198) =
                           (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_660.ray + 0x198);
                      *(uint *)(local_660.ray + 0x19c) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_660.ray + 0x19c);
                      iVar1 = *(int *)(local_660.hit + 0x24);
                      iVar2 = *(int *)(local_660.hit + 0x28);
                      iVar60 = *(int *)(local_660.hit + 0x2c);
                      iVar61 = *(int *)(local_660.hit + 0x30);
                      iVar62 = *(int *)(local_660.hit + 0x34);
                      iVar63 = *(int *)(local_660.hit + 0x38);
                      iVar64 = *(int *)(local_660.hit + 0x3c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_660.ray + 0x1a0) =
                           (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x20) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x1a0);
                      *(uint *)(local_660.ray + 0x1a4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_660.ray + 0x1a4);
                      *(uint *)(local_660.ray + 0x1a8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1a8);
                      *(uint *)(local_660.ray + 0x1ac) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1ac);
                      *(uint *)(local_660.ray + 0x1b0) =
                           (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1b0);
                      *(uint *)(local_660.ray + 0x1b4) =
                           (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1b4);
                      *(uint *)(local_660.ray + 0x1b8) =
                           (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1b8);
                      *(uint *)(local_660.ray + 0x1bc) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1bc);
                      iVar1 = *(int *)(local_660.hit + 0x44);
                      iVar2 = *(int *)(local_660.hit + 0x48);
                      iVar60 = *(int *)(local_660.hit + 0x4c);
                      iVar61 = *(int *)(local_660.hit + 0x50);
                      iVar62 = *(int *)(local_660.hit + 0x54);
                      iVar63 = *(int *)(local_660.hit + 0x58);
                      iVar64 = *(int *)(local_660.hit + 0x5c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_660.ray + 0x1c0) =
                           (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x40) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x1c0);
                      *(uint *)(local_660.ray + 0x1c4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_660.ray + 0x1c4);
                      *(uint *)(local_660.ray + 0x1c8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1c8);
                      *(uint *)(local_660.ray + 0x1cc) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1cc);
                      *(uint *)(local_660.ray + 0x1d0) =
                           (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1d0);
                      *(uint *)(local_660.ray + 0x1d4) =
                           (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1d4);
                      *(uint *)(local_660.ray + 0x1d8) =
                           (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1d8);
                      *(uint *)(local_660.ray + 0x1dc) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1dc);
                      iVar1 = *(int *)(local_660.hit + 100);
                      iVar2 = *(int *)(local_660.hit + 0x68);
                      iVar60 = *(int *)(local_660.hit + 0x6c);
                      iVar61 = *(int *)(local_660.hit + 0x70);
                      iVar62 = *(int *)(local_660.hit + 0x74);
                      iVar63 = *(int *)(local_660.hit + 0x78);
                      iVar64 = *(int *)(local_660.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_660.ray + 0x1e0) =
                           (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x60) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x1e0);
                      *(uint *)(local_660.ray + 0x1e4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_660.ray + 0x1e4);
                      *(uint *)(local_660.ray + 0x1e8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1e8);
                      *(uint *)(local_660.ray + 0x1ec) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1ec);
                      *(uint *)(local_660.ray + 0x1f0) =
                           (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1f0);
                      *(uint *)(local_660.ray + 500) =
                           (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_660.ray + 500);
                      *(uint *)(local_660.ray + 0x1f8) =
                           (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1f8);
                      *(uint *)(local_660.ray + 0x1fc) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1fc);
                      iVar1 = *(int *)(local_660.hit + 0x84);
                      iVar2 = *(int *)(local_660.hit + 0x88);
                      iVar60 = *(int *)(local_660.hit + 0x8c);
                      iVar61 = *(int *)(local_660.hit + 0x90);
                      iVar62 = *(int *)(local_660.hit + 0x94);
                      iVar63 = *(int *)(local_660.hit + 0x98);
                      iVar64 = *(int *)(local_660.hit + 0x9c);
                      bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar21 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar21 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar21 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar21 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar21 >> 6) & 1);
                      bVar18 = SUB81(uVar21 >> 7,0);
                      *(uint *)(local_660.ray + 0x200) =
                           (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x80) |
                           (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x200);
                      *(uint *)(local_660.ray + 0x204) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_660.ray + 0x204);
                      *(uint *)(local_660.ray + 0x208) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_660.ray + 0x208);
                      *(uint *)(local_660.ray + 0x20c) =
                           (uint)bVar14 * iVar60 | (uint)!bVar14 * *(int *)(local_660.ray + 0x20c);
                      *(uint *)(local_660.ray + 0x210) =
                           (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_660.ray + 0x210);
                      *(uint *)(local_660.ray + 0x214) =
                           (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_660.ray + 0x214);
                      *(uint *)(local_660.ray + 0x218) =
                           (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_660.ray + 0x218);
                      *(uint *)(local_660.ray + 0x21c) =
                           (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_660.ray + 0x21c);
                      auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                      *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar115;
                      auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                      *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar115;
                      auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                      *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar115;
                      auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100));
                      *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar115;
                      local_580._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_580._4_4_ = 0;
                      local_580._8_4_ = 0;
                      local_580._12_4_ = 0;
                    }
                    bVar75 = ~(byte)(1 << ((uint)uVar67 & 0x1f)) & (byte)uVar76;
                    auVar160._4_4_ = local_580._0_4_;
                    auVar160._0_4_ = local_580._0_4_;
                    auVar160._8_4_ = local_580._0_4_;
                    auVar160._12_4_ = local_580._0_4_;
                    auVar160._16_4_ = local_580._0_4_;
                    auVar160._20_4_ = local_580._0_4_;
                    auVar160._24_4_ = local_580._0_4_;
                    auVar160._28_4_ = local_580._0_4_;
                    uVar163 = vcmpps_avx512vl(auVar209._0_32_,auVar160,2);
                    if ((bVar75 & (byte)uVar163) == 0) goto LAB_018b094d;
                    bVar75 = bVar75 & (byte)uVar163;
                    uVar76 = (ulong)bVar75;
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar115 = vblendmps_avx512vl(auVar161,auVar209._0_32_);
                    auVar140._0_4_ =
                         (uint)(bVar75 & 1) * auVar115._0_4_ |
                         (uint)!(bool)(bVar75 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar75 >> 1 & 1);
                    auVar140._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar75 >> 2 & 1);
                    auVar140._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar75 >> 3 & 1);
                    auVar140._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar75 >> 4 & 1);
                    auVar140._16_4_ = (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar75 >> 5 & 1);
                    auVar140._20_4_ = (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar75 >> 6 & 1);
                    auVar140._24_4_ = (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar140._28_4_ =
                         (uint)(bVar75 >> 7) * auVar115._28_4_ |
                         (uint)!(bool)(bVar75 >> 7) * 0x7f800000;
                    auVar115 = vshufps_avx(auVar140,auVar140,0xb1);
                    auVar115 = vminps_avx(auVar140,auVar115);
                    auVar116 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar116);
                    auVar116 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar116);
                    uVar163 = vcmpps_avx512vl(auVar140,auVar115,0);
                    bVar66 = (byte)uVar163 & bVar75;
                    if (bVar66 != 0) {
                      bVar75 = bVar66;
                    }
                    uVar74 = 0;
                    for (uVar68 = (uint)bVar75; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000
                        ) {
                      uVar74 = uVar74 + 1;
                    }
                    uVar67 = (ulong)uVar74;
                  } while( true );
                }
                fVar168 = local_380[uVar67];
                uVar162 = *(undefined4 *)(local_360 + uVar67 * 4);
                fVar213 = 1.0 - fVar168;
                fVar212 = fVar213 * fVar213 * -3.0;
                auVar197 = ZEXT464((uint)fVar212);
                auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                          ZEXT416((uint)(fVar168 * fVar213)),ZEXT416(0xc0000000));
                auVar95 = vfmsub132ss_fma(ZEXT416((uint)(fVar168 * fVar213)),
                                          ZEXT416((uint)(fVar168 * fVar168)),ZEXT416(0x40000000));
                fVar213 = auVar92._0_4_ * 3.0;
                fVar214 = auVar95._0_4_ * 3.0;
                fVar167 = fVar168 * fVar168 * 3.0;
                auVar199._0_4_ = fVar167 * fVar19;
                auVar199._4_4_ = fVar167 * fVar57;
                auVar199._8_4_ = fVar167 * fVar58;
                auVar199._12_4_ = fVar167 * fVar59;
                auVar207 = ZEXT1664(auVar199);
                auVar170._4_4_ = fVar214;
                auVar170._0_4_ = fVar214;
                auVar170._8_4_ = fVar214;
                auVar170._12_4_ = fVar214;
                auVar92 = vfmadd132ps_fma(auVar170,auVar199,auVar90);
                auVar182._4_4_ = fVar213;
                auVar182._0_4_ = fVar213;
                auVar182._8_4_ = fVar213;
                auVar182._12_4_ = fVar213;
                auVar92 = vfmadd132ps_fma(auVar182,auVar92,auVar20);
                auVar171._4_4_ = fVar212;
                auVar171._0_4_ = fVar212;
                auVar171._8_4_ = fVar212;
                auVar171._12_4_ = fVar212;
                auVar92 = vfmadd132ps_fma(auVar171,auVar92,auVar93);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar67 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar92._0_4_;
                uVar8 = vextractps_avx(auVar92,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                uVar8 = vextractps_avx(auVar92,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                *(float *)(ray + k * 4 + 0x1e0) = fVar168;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar162;
                *(uint *)(ray + k * 4 + 0x220) = uVar74;
                *(uint *)(ray + k * 4 + 0x240) = uVar6;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
            }
          }
        }
      }
    }
LAB_018b094d:
    if (8 < iVar7) {
      local_580 = vpbroadcastd_avx512vl();
      local_5a0._4_4_ = local_630._0_4_;
      local_5a0._0_4_ = local_630._0_4_;
      local_5a0._8_4_ = local_630._0_4_;
      local_5a0._12_4_ = local_630._0_4_;
      local_5a0._16_4_ = local_630._0_4_;
      local_5a0._20_4_ = local_630._0_4_;
      local_5a0._24_4_ = local_630._0_4_;
      local_5a0._28_4_ = local_630._0_4_;
      uStack_55c = local_560;
      uStack_558 = local_560;
      uStack_554 = local_560;
      uStack_550 = local_560;
      uStack_54c = local_560;
      uStack_548 = local_560;
      uStack_544 = local_560;
      local_100 = 1.0 / (float)local_5c0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar70 = 8;
LAB_018b09e1:
      if (lVar70 < iVar7) {
        auVar115 = vpbroadcastd_avx512vl();
        auVar115 = vpor_avx2(auVar115,_DAT_01fb4ba0);
        uVar22 = vpcmpd_avx512vl(auVar115,local_580,1);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar70 * 4 + lVar73);
        auVar116 = *(undefined1 (*) [32])(lVar73 + 0x21fb768 + lVar70 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar73 + 0x21fbbec + lVar70 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar73 + 0x21fc070 + lVar70 * 4);
        fVar168 = auVar113._0_4_;
        auVar208._0_4_ = fVar168 * (float)local_520._0_4_;
        fVar212 = auVar113._4_4_;
        auVar208._4_4_ = fVar212 * (float)local_520._4_4_;
        fVar213 = auVar113._8_4_;
        auVar208._8_4_ = fVar213 * fStack_518;
        fVar214 = auVar113._12_4_;
        auVar208._12_4_ = fVar214 * fStack_514;
        fVar167 = auVar113._16_4_;
        auVar208._16_4_ = fVar167 * fStack_510;
        fVar176 = auVar113._20_4_;
        auVar208._20_4_ = fVar176 * fStack_50c;
        auVar208._28_36_ = auVar207._28_36_;
        fVar77 = auVar113._24_4_;
        auVar208._24_4_ = fVar77 * fStack_508;
        auVar207._0_4_ = fVar168 * (float)local_540._0_4_;
        auVar207._4_4_ = fVar212 * (float)local_540._4_4_;
        auVar207._8_4_ = fVar213 * fStack_538;
        auVar207._12_4_ = fVar214 * fStack_534;
        auVar207._16_4_ = fVar167 * fStack_530;
        auVar207._20_4_ = fVar176 * fStack_52c;
        auVar207._28_36_ = auVar197._28_36_;
        auVar207._24_4_ = fVar77 * fStack_528;
        auVar101 = vmulps_avx512vl(local_e0,auVar113);
        auVar102 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar114,local_4e0);
        auVar112 = vfmadd231ps_avx512vl(auVar207._0_32_,auVar114,local_500);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar114,local_c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar116,local_4a0);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_4c0);
        auVar111 = vfmadd231ps_avx512vl(auVar101,auVar116,local_a0);
        auVar92 = vfmadd231ps_fma(auVar102,auVar115,local_460);
        auVar207 = ZEXT1664(auVar92);
        auVar95 = vfmadd231ps_fma(auVar112,auVar115,local_480);
        auVar197 = ZEXT1664(auVar95);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar70 * 4 + lVar73);
        auVar102 = *(undefined1 (*) [32])(lVar73 + 0x21fdb88 + lVar70 * 4);
        auVar104 = vfmadd231ps_avx512vl(auVar111,auVar115,local_80);
        auVar112 = *(undefined1 (*) [32])(lVar73 + 0x21fe00c + lVar70 * 4);
        auVar111 = *(undefined1 (*) [32])(lVar73 + 0x21fe490 + lVar70 * 4);
        fVar78 = auVar111._0_4_;
        auVar210._0_4_ = fVar78 * (float)local_520._0_4_;
        fVar141 = auVar111._4_4_;
        auVar210._4_4_ = fVar141 * (float)local_520._4_4_;
        fVar142 = auVar111._8_4_;
        auVar210._8_4_ = fVar142 * fStack_518;
        fVar143 = auVar111._12_4_;
        auVar210._12_4_ = fVar143 * fStack_514;
        fVar144 = auVar111._16_4_;
        auVar210._16_4_ = fVar144 * fStack_510;
        fVar146 = auVar111._20_4_;
        auVar210._20_4_ = fVar146 * fStack_50c;
        auVar210._28_36_ = auVar209._28_36_;
        fVar147 = auVar111._24_4_;
        auVar210._24_4_ = fVar147 * fStack_508;
        auVar37._4_4_ = fVar141 * (float)local_540._4_4_;
        auVar37._0_4_ = fVar78 * (float)local_540._0_4_;
        auVar37._8_4_ = fVar142 * fStack_538;
        auVar37._12_4_ = fVar143 * fStack_534;
        auVar37._16_4_ = fVar144 * fStack_530;
        auVar37._20_4_ = fVar146 * fStack_52c;
        auVar37._24_4_ = fVar147 * fStack_528;
        auVar37._28_4_ = uStack_524;
        auVar103 = vmulps_avx512vl(local_e0,auVar111);
        auVar105 = vfmadd231ps_avx512vl(auVar210._0_32_,auVar112,local_4e0);
        auVar106 = vfmadd231ps_avx512vl(auVar37,auVar112,local_500);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar112,local_c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_4a0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_4c0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,local_a0);
        auVar94 = vfmadd231ps_fma(auVar105,auVar101,local_460);
        auVar209 = ZEXT1664(auVar94);
        auVar88 = vfmadd231ps_fma(auVar106,auVar101,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar103,auVar101,local_80);
        auVar106 = vmaxps_avx512vl(auVar104,auVar105);
        auVar103 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar92));
        auVar107 = vsubps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar95));
        auVar108 = vmulps_avx512vl(ZEXT1632(auVar95),auVar103);
        auVar109 = vmulps_avx512vl(ZEXT1632(auVar92),auVar107);
        auVar108 = vsubps_avx512vl(auVar108,auVar109);
        auVar109 = vmulps_avx512vl(auVar107,auVar107);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar103);
        auVar106 = vmulps_avx512vl(auVar106,auVar106);
        auVar106 = vmulps_avx512vl(auVar106,auVar109);
        auVar108 = vmulps_avx512vl(auVar108,auVar108);
        uVar163 = vcmpps_avx512vl(auVar108,auVar106,2);
        bVar75 = (byte)uVar22 & (byte)uVar163;
        if (bVar75 != 0) {
          fVar145 = local_2a0._0_4_;
          fVar148 = local_2a0._4_4_;
          auVar38._4_4_ = fVar148 * fVar141;
          auVar38._0_4_ = fVar145 * fVar78;
          fVar78 = local_2a0._8_4_;
          auVar38._8_4_ = fVar78 * fVar142;
          fVar141 = local_2a0._12_4_;
          auVar38._12_4_ = fVar141 * fVar143;
          fVar142 = local_2a0._16_4_;
          auVar38._16_4_ = fVar142 * fVar144;
          fVar143 = local_2a0._20_4_;
          auVar38._20_4_ = fVar143 * fVar146;
          fVar144 = local_2a0._24_4_;
          auVar38._24_4_ = fVar144 * fVar147;
          auVar38._28_4_ = auVar111._28_4_;
          auVar112 = vfmadd213ps_avx512vl(auVar112,local_280,auVar38);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_260,auVar112);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_240,auVar102);
          auVar39._4_4_ = fVar148 * fVar212;
          auVar39._0_4_ = fVar145 * fVar168;
          auVar39._8_4_ = fVar78 * fVar213;
          auVar39._12_4_ = fVar141 * fVar214;
          auVar39._16_4_ = fVar142 * fVar167;
          auVar39._20_4_ = fVar143 * fVar176;
          auVar39._24_4_ = fVar144 * fVar77;
          auVar39._28_4_ = auVar113._28_4_;
          auVar114 = vfmadd213ps_avx512vl(auVar114,local_280,auVar39);
          auVar116 = vfmadd213ps_avx512vl(auVar116,local_260,auVar114);
          auVar102 = vfmadd213ps_avx512vl(auVar115,local_240,auVar116);
          auVar115 = *(undefined1 (*) [32])(lVar73 + 0x21fc4f4 + lVar70 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar73 + 0x21fc978 + lVar70 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar73 + 0x21fcdfc + lVar70 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar73 + 0x21fd280 + lVar70 * 4);
          auVar112 = vmulps_avx512vl(_local_520,auVar113);
          auVar111 = vmulps_avx512vl(_local_540,auVar113);
          auVar40._4_4_ = fVar148 * auVar113._4_4_;
          auVar40._0_4_ = fVar145 * auVar113._0_4_;
          auVar40._8_4_ = fVar78 * auVar113._8_4_;
          auVar40._12_4_ = fVar141 * auVar113._12_4_;
          auVar40._16_4_ = fVar142 * auVar113._16_4_;
          auVar40._20_4_ = fVar143 * auVar113._20_4_;
          auVar40._24_4_ = fVar144 * auVar113._24_4_;
          auVar40._28_4_ = auVar113._28_4_;
          auVar113 = vfmadd231ps_avx512vl(auVar112,auVar114,local_4e0);
          auVar112 = vfmadd231ps_avx512vl(auVar111,auVar114,local_500);
          auVar114 = vfmadd231ps_avx512vl(auVar40,local_280,auVar114);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_4a0);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar116,local_4c0);
          auVar116 = vfmadd231ps_avx512vl(auVar114,local_260,auVar116);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_460);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_480);
          auVar111 = vfmadd231ps_avx512vl(auVar116,local_240,auVar115);
          auVar115 = *(undefined1 (*) [32])(lVar73 + 0x21fe914 + lVar70 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar73 + 0x21ff21c + lVar70 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar73 + 0x21ff6a0 + lVar70 * 4);
          auVar106 = vmulps_avx512vl(_local_520,auVar114);
          auVar108 = vmulps_avx512vl(_local_540,auVar114);
          auVar114 = vmulps_avx512vl(local_2a0,auVar114);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,local_4e0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,local_500);
          auVar114 = vfmadd231ps_avx512vl(auVar114,local_280,auVar116);
          auVar229 = ZEXT1664(auVar229._0_16_);
          auVar116 = *(undefined1 (*) [32])(lVar73 + 0x21fed98 + lVar70 * 4);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar116,local_4a0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar116,local_4c0);
          auVar116 = vfmadd231ps_avx512vl(auVar114,local_260,auVar116);
          auVar230 = ZEXT1664(auVar230._0_16_);
          auVar114 = vfmadd231ps_avx512vl(auVar106,auVar115,local_460);
          auVar106 = vfmadd231ps_avx512vl(auVar108,auVar115,local_480);
          auVar116 = vfmadd231ps_avx512vl(auVar116,local_240,auVar115);
          auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar113,auVar108);
          vandps_avx512vl(auVar112,auVar108);
          auVar115 = vmaxps_avx(auVar108,auVar108);
          vandps_avx512vl(auVar111,auVar108);
          auVar115 = vmaxps_avx(auVar115,auVar108);
          uVar67 = vcmpps_avx512vl(auVar115,local_5a0,1);
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar128._0_4_ = (float)((uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar113._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar113._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar113._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar113._12_4_);
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar113._16_4_);
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar113._20_4_);
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar113._24_4_);
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar128._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar113._28_4_;
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar129._0_4_ = (float)((uint)bVar12 * auVar107._0_4_ | (uint)!bVar12 * auVar112._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar112._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar112._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar129._12_4_ =
               (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar112._12_4_);
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar129._16_4_ =
               (float)((uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * auVar112._16_4_);
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar129._20_4_ =
               (float)((uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * auVar112._20_4_);
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar129._24_4_ =
               (float)((uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * auVar112._24_4_);
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar129._28_4_ = (uint)bVar12 * auVar107._28_4_ | (uint)!bVar12 * auVar112._28_4_;
          vandps_avx512vl(auVar114,auVar108);
          vandps_avx512vl(auVar106,auVar108);
          auVar115 = vmaxps_avx(auVar129,auVar129);
          vandps_avx512vl(auVar116,auVar108);
          auVar115 = vmaxps_avx(auVar115,auVar129);
          uVar67 = vcmpps_avx512vl(auVar115,local_5a0,1);
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar130._0_4_ = (uint)bVar12 * auVar103._0_4_ | (uint)!bVar12 * auVar114._0_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar114._4_4_;
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar114._8_4_;
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar114._12_4_;
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar12 * auVar103._16_4_ | (uint)!bVar12 * auVar114._16_4_;
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar12 * auVar103._20_4_ | (uint)!bVar12 * auVar114._20_4_;
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar12 * auVar103._24_4_ | (uint)!bVar12 * auVar114._24_4_;
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar130._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar114._28_4_;
          bVar12 = (bool)((byte)uVar67 & 1);
          auVar131._0_4_ = (float)((uint)bVar12 * auVar107._0_4_ | (uint)!bVar12 * auVar106._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar12 * auVar107._4_4_ | (uint)!bVar12 * auVar106._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar12 * auVar107._8_4_ | (uint)!bVar12 * auVar106._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar131._12_4_ =
               (float)((uint)bVar12 * auVar107._12_4_ | (uint)!bVar12 * auVar106._12_4_);
          bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar131._16_4_ =
               (float)((uint)bVar12 * auVar107._16_4_ | (uint)!bVar12 * auVar106._16_4_);
          bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar131._20_4_ =
               (float)((uint)bVar12 * auVar107._20_4_ | (uint)!bVar12 * auVar106._20_4_);
          bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar131._24_4_ =
               (float)((uint)bVar12 * auVar107._24_4_ | (uint)!bVar12 * auVar106._24_4_);
          bVar12 = SUB81(uVar67 >> 7,0);
          auVar131._28_4_ = (uint)bVar12 * auVar107._28_4_ | (uint)!bVar12 * auVar106._28_4_;
          auVar216._8_4_ = 0x80000000;
          auVar216._0_8_ = 0x8000000080000000;
          auVar216._12_4_ = 0x80000000;
          auVar216._16_4_ = 0x80000000;
          auVar216._20_4_ = 0x80000000;
          auVar216._24_4_ = 0x80000000;
          auVar216._28_4_ = 0x80000000;
          auVar115 = vxorps_avx512vl(auVar130,auVar216);
          auVar100 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
          auVar116 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar100));
          auVar84 = vfmadd231ps_fma(auVar116,auVar129,auVar129);
          auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
          auVar227._8_4_ = 0xbf000000;
          auVar227._0_8_ = 0xbf000000bf000000;
          auVar227._12_4_ = 0xbf000000;
          auVar227._16_4_ = 0xbf000000;
          auVar227._20_4_ = 0xbf000000;
          auVar227._24_4_ = 0xbf000000;
          auVar227._28_4_ = 0xbf000000;
          fVar168 = auVar116._0_4_;
          fVar212 = auVar116._4_4_;
          fVar213 = auVar116._8_4_;
          fVar214 = auVar116._12_4_;
          fVar167 = auVar116._16_4_;
          fVar176 = auVar116._20_4_;
          fVar77 = auVar116._24_4_;
          auVar41._4_4_ = fVar212 * fVar212 * fVar212 * auVar84._4_4_ * -0.5;
          auVar41._0_4_ = fVar168 * fVar168 * fVar168 * auVar84._0_4_ * -0.5;
          auVar41._8_4_ = fVar213 * fVar213 * fVar213 * auVar84._8_4_ * -0.5;
          auVar41._12_4_ = fVar214 * fVar214 * fVar214 * auVar84._12_4_ * -0.5;
          auVar41._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar41._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
          auVar41._24_4_ = fVar77 * fVar77 * fVar77 * -0.0;
          auVar41._28_4_ = auVar129._28_4_;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar116 = vfmadd231ps_avx512vl(auVar41,auVar114,auVar116);
          auVar42._4_4_ = auVar129._4_4_ * auVar116._4_4_;
          auVar42._0_4_ = auVar129._0_4_ * auVar116._0_4_;
          auVar42._8_4_ = auVar129._8_4_ * auVar116._8_4_;
          auVar42._12_4_ = auVar129._12_4_ * auVar116._12_4_;
          auVar42._16_4_ = auVar129._16_4_ * auVar116._16_4_;
          auVar42._20_4_ = auVar129._20_4_ * auVar116._20_4_;
          auVar42._24_4_ = auVar129._24_4_ * auVar116._24_4_;
          auVar42._28_4_ = 0;
          auVar43._4_4_ = auVar116._4_4_ * -auVar128._4_4_;
          auVar43._0_4_ = auVar116._0_4_ * -auVar128._0_4_;
          auVar43._8_4_ = auVar116._8_4_ * -auVar128._8_4_;
          auVar43._12_4_ = auVar116._12_4_ * -auVar128._12_4_;
          auVar43._16_4_ = auVar116._16_4_ * -auVar128._16_4_;
          auVar43._20_4_ = auVar116._20_4_ * -auVar128._20_4_;
          auVar43._24_4_ = auVar116._24_4_ * -auVar128._24_4_;
          auVar43._28_4_ = auVar129._28_4_;
          auVar113 = vmulps_avx512vl(auVar116,ZEXT1632(auVar100));
          auVar111 = ZEXT1632(auVar100);
          auVar116 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar111);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar131,auVar131);
          auVar112 = vrsqrt14ps_avx512vl(auVar116);
          auVar116 = vmulps_avx512vl(auVar116,auVar227);
          fVar168 = auVar112._0_4_;
          fVar212 = auVar112._4_4_;
          fVar213 = auVar112._8_4_;
          fVar214 = auVar112._12_4_;
          fVar167 = auVar112._16_4_;
          fVar176 = auVar112._20_4_;
          fVar77 = auVar112._24_4_;
          auVar44._4_4_ = fVar212 * fVar212 * fVar212 * auVar116._4_4_;
          auVar44._0_4_ = fVar168 * fVar168 * fVar168 * auVar116._0_4_;
          auVar44._8_4_ = fVar213 * fVar213 * fVar213 * auVar116._8_4_;
          auVar44._12_4_ = fVar214 * fVar214 * fVar214 * auVar116._12_4_;
          auVar44._16_4_ = fVar167 * fVar167 * fVar167 * auVar116._16_4_;
          auVar44._20_4_ = fVar176 * fVar176 * fVar176 * auVar116._20_4_;
          auVar44._24_4_ = fVar77 * fVar77 * fVar77 * auVar116._24_4_;
          auVar44._28_4_ = auVar116._28_4_;
          auVar116 = vfmadd231ps_avx512vl(auVar44,auVar114,auVar112);
          auVar45._4_4_ = auVar131._4_4_ * auVar116._4_4_;
          auVar45._0_4_ = auVar131._0_4_ * auVar116._0_4_;
          auVar45._8_4_ = auVar131._8_4_ * auVar116._8_4_;
          auVar45._12_4_ = auVar131._12_4_ * auVar116._12_4_;
          auVar45._16_4_ = auVar131._16_4_ * auVar116._16_4_;
          auVar45._20_4_ = auVar131._20_4_ * auVar116._20_4_;
          auVar45._24_4_ = auVar131._24_4_ * auVar116._24_4_;
          auVar45._28_4_ = auVar112._28_4_;
          auVar46._4_4_ = auVar116._4_4_ * auVar115._4_4_;
          auVar46._0_4_ = auVar116._0_4_ * auVar115._0_4_;
          auVar46._8_4_ = auVar116._8_4_ * auVar115._8_4_;
          auVar46._12_4_ = auVar116._12_4_ * auVar115._12_4_;
          auVar46._16_4_ = auVar116._16_4_ * auVar115._16_4_;
          auVar46._20_4_ = auVar116._20_4_ * auVar115._20_4_;
          auVar46._24_4_ = auVar116._24_4_ * auVar115._24_4_;
          auVar46._28_4_ = auVar115._28_4_;
          auVar115 = vmulps_avx512vl(auVar116,auVar111);
          auVar84 = vfmadd213ps_fma(auVar42,auVar104,ZEXT1632(auVar92));
          auVar85 = vfmadd213ps_fma(auVar43,auVar104,ZEXT1632(auVar95));
          auVar114 = vfmadd213ps_avx512vl(auVar113,auVar104,auVar102);
          auVar112 = vfmadd213ps_avx512vl(auVar45,auVar105,ZEXT1632(auVar94));
          auVar87 = vfnmadd213ps_fma(auVar42,auVar104,ZEXT1632(auVar92));
          auVar92 = vfmadd213ps_fma(auVar46,auVar105,ZEXT1632(auVar88));
          auVar89 = vfnmadd213ps_fma(auVar43,auVar104,ZEXT1632(auVar95));
          auVar95 = vfmadd213ps_fma(auVar115,auVar105,auVar101);
          auVar228 = vfnmadd231ps_fma(auVar102,auVar104,auVar113);
          auVar91 = vfnmadd213ps_fma(auVar45,auVar105,ZEXT1632(auVar94));
          auVar98 = vfnmadd213ps_fma(auVar46,auVar105,ZEXT1632(auVar88));
          auVar99 = vfnmadd231ps_fma(auVar101,auVar105,auVar115);
          auVar101 = vsubps_avx512vl(auVar112,ZEXT1632(auVar87));
          auVar115 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar89));
          auVar116 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar228));
          auVar47._4_4_ = auVar115._4_4_ * auVar228._4_4_;
          auVar47._0_4_ = auVar115._0_4_ * auVar228._0_4_;
          auVar47._8_4_ = auVar115._8_4_ * auVar228._8_4_;
          auVar47._12_4_ = auVar115._12_4_ * auVar228._12_4_;
          auVar47._16_4_ = auVar115._16_4_ * 0.0;
          auVar47._20_4_ = auVar115._20_4_ * 0.0;
          auVar47._24_4_ = auVar115._24_4_ * 0.0;
          auVar47._28_4_ = auVar113._28_4_;
          auVar94 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar89),auVar116);
          auVar48._4_4_ = auVar116._4_4_ * auVar87._4_4_;
          auVar48._0_4_ = auVar116._0_4_ * auVar87._0_4_;
          auVar48._8_4_ = auVar116._8_4_ * auVar87._8_4_;
          auVar48._12_4_ = auVar116._12_4_ * auVar87._12_4_;
          auVar48._16_4_ = auVar116._16_4_ * 0.0;
          auVar48._20_4_ = auVar116._20_4_ * 0.0;
          auVar48._24_4_ = auVar116._24_4_ * 0.0;
          auVar48._28_4_ = auVar116._28_4_;
          auVar88 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar228),auVar101);
          auVar49._4_4_ = auVar89._4_4_ * auVar101._4_4_;
          auVar49._0_4_ = auVar89._0_4_ * auVar101._0_4_;
          auVar49._8_4_ = auVar89._8_4_ * auVar101._8_4_;
          auVar49._12_4_ = auVar89._12_4_ * auVar101._12_4_;
          auVar49._16_4_ = auVar101._16_4_ * 0.0;
          auVar49._20_4_ = auVar101._20_4_ * 0.0;
          auVar49._24_4_ = auVar101._24_4_ * 0.0;
          auVar49._28_4_ = auVar101._28_4_;
          auVar86 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar87),auVar115);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar111,ZEXT1632(auVar88));
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,ZEXT1632(auVar94));
          auVar108 = ZEXT1632(auVar100);
          uVar67 = vcmpps_avx512vl(auVar115,auVar108,2);
          bVar66 = (byte)uVar67;
          fVar142 = (float)((uint)(bVar66 & 1) * auVar84._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar91._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          fVar144 = (float)((uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * auVar91._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          fVar147 = (float)((uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * auVar91._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          fVar148 = (float)((uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * auVar91._12_4_);
          auVar111 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar144,fVar142))));
          fVar143 = (float)((uint)(bVar66 & 1) * auVar85._0_4_ |
                           (uint)!(bool)(bVar66 & 1) * auVar98._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          fVar146 = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar98._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          fVar145 = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar98._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          fVar149 = (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar98._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar145,CONCAT44(fVar146,fVar143))));
          auVar132._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar114._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar99._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar12 * auVar114._4_4_ | (uint)!bVar12 * auVar99._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar12 * auVar114._8_4_ | (uint)!bVar12 * auVar99._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar12 * auVar114._12_4_ | (uint)!bVar12 * auVar99._12_4_)
          ;
          fVar168 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar114._16_4_);
          auVar132._16_4_ = fVar168;
          fVar212 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar114._20_4_);
          auVar132._20_4_ = fVar212;
          fVar213 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar114._24_4_);
          auVar132._24_4_ = fVar213;
          iVar1 = (uint)(byte)(uVar67 >> 7) * auVar114._28_4_;
          auVar132._28_4_ = iVar1;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar112);
          auVar133._0_4_ =
               (uint)(bVar66 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar94._0_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar94._4_4_;
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar94._8_4_;
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar94._12_4_;
          auVar133._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * auVar115._16_4_;
          auVar133._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * auVar115._20_4_;
          auVar133._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * auVar115._24_4_;
          auVar133._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar115._28_4_;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar92));
          auVar134._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar84._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar84._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar84._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar134._12_4_ = (float)((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar84._12_4_)
          ;
          fVar167 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar115._16_4_);
          auVar134._16_4_ = fVar167;
          fVar176 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar115._20_4_);
          auVar134._20_4_ = fVar176;
          fVar214 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar115._24_4_);
          auVar134._24_4_ = fVar214;
          auVar134._28_4_ = (uint)(byte)(uVar67 >> 7) * auVar115._28_4_;
          auVar115 = vblendmps_avx512vl(ZEXT1632(auVar228),ZEXT1632(auVar95));
          auVar135._0_4_ =
               (float)((uint)(bVar66 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar66 & 1) * auVar85._0_4_);
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * auVar85._4_4_);
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * auVar85._8_4_);
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar135._12_4_ = (float)((uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * auVar85._12_4_)
          ;
          fVar77 = (float)((uint)((byte)(uVar67 >> 4) & 1) * auVar115._16_4_);
          auVar135._16_4_ = fVar77;
          fVar78 = (float)((uint)((byte)(uVar67 >> 5) & 1) * auVar115._20_4_);
          auVar135._20_4_ = fVar78;
          fVar141 = (float)((uint)((byte)(uVar67 >> 6) & 1) * auVar115._24_4_);
          auVar135._24_4_ = fVar141;
          iVar2 = (uint)(byte)(uVar67 >> 7) * auVar115._28_4_;
          auVar135._28_4_ = iVar2;
          auVar136._0_4_ =
               (uint)(bVar66 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar112._0_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar12 * (int)auVar87._4_4_ | (uint)!bVar12 * auVar112._4_4_;
          bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar12 * (int)auVar87._8_4_ | (uint)!bVar12 * auVar112._8_4_;
          bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar12 * (int)auVar87._12_4_ | (uint)!bVar12 * auVar112._12_4_;
          auVar136._16_4_ = (uint)!(bool)((byte)(uVar67 >> 4) & 1) * auVar112._16_4_;
          auVar136._20_4_ = (uint)!(bool)((byte)(uVar67 >> 5) & 1) * auVar112._20_4_;
          auVar136._24_4_ = (uint)!(bool)((byte)(uVar67 >> 6) & 1) * auVar112._24_4_;
          auVar136._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar112._28_4_;
          bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar67 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar67 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar112 = vsubps_avx512vl(auVar136,auVar111);
          auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar89._12_4_ |
                                                   (uint)!bVar16 * auVar92._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar89._8_4_ |
                                                            (uint)!bVar14 * auVar92._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar89._4_4_ |
                                                                     (uint)!bVar12 * auVar92._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar89._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar92._0_4_)))),auVar103);
          auVar207 = ZEXT3264(auVar116);
          auVar114 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar228._12_4_ |
                                                   (uint)!bVar17 * auVar95._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar228._8_4_ |
                                                            (uint)!bVar15 * auVar95._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar228._4_4_ |
                                                                     (uint)!bVar13 * auVar95._4_4_,
                                                                     (uint)(bVar66 & 1) *
                                                                     (int)auVar228._0_4_ |
                                                                     (uint)!(bool)(bVar66 & 1) *
                                                                     auVar95._0_4_)))),auVar132);
          auVar113 = vsubps_avx(auVar111,auVar133);
          auVar209 = ZEXT3264(auVar113);
          auVar101 = vsubps_avx(auVar103,auVar134);
          auVar102 = vsubps_avx(auVar132,auVar135);
          auVar50._4_4_ = auVar114._4_4_ * fVar144;
          auVar50._0_4_ = auVar114._0_4_ * fVar142;
          auVar50._8_4_ = auVar114._8_4_ * fVar147;
          auVar50._12_4_ = auVar114._12_4_ * fVar148;
          auVar50._16_4_ = auVar114._16_4_ * 0.0;
          auVar50._20_4_ = auVar114._20_4_ * 0.0;
          auVar50._24_4_ = auVar114._24_4_ * 0.0;
          auVar50._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar50,auVar132,auVar112);
          auVar187._0_4_ = fVar143 * auVar112._0_4_;
          auVar187._4_4_ = fVar146 * auVar112._4_4_;
          auVar187._8_4_ = fVar145 * auVar112._8_4_;
          auVar187._12_4_ = fVar149 * auVar112._12_4_;
          auVar187._16_4_ = auVar112._16_4_ * 0.0;
          auVar187._20_4_ = auVar112._20_4_ * 0.0;
          auVar187._24_4_ = auVar112._24_4_ * 0.0;
          auVar187._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar187,auVar111,auVar116);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar108,ZEXT1632(auVar92));
          auVar193._0_4_ = auVar116._0_4_ * auVar132._0_4_;
          auVar193._4_4_ = auVar116._4_4_ * auVar132._4_4_;
          auVar193._8_4_ = auVar116._8_4_ * auVar132._8_4_;
          auVar193._12_4_ = auVar116._12_4_ * auVar132._12_4_;
          auVar193._16_4_ = auVar116._16_4_ * fVar168;
          auVar193._20_4_ = auVar116._20_4_ * fVar212;
          auVar193._24_4_ = auVar116._24_4_ * fVar213;
          auVar193._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar193,auVar103,auVar114);
          auVar106 = vfmadd231ps_avx512vl(auVar115,auVar108,ZEXT1632(auVar92));
          auVar115 = vmulps_avx512vl(auVar102,auVar133);
          auVar115 = vfmsub231ps_avx512vl(auVar115,auVar113,auVar135);
          auVar51._4_4_ = auVar101._4_4_ * auVar135._4_4_;
          auVar51._0_4_ = auVar101._0_4_ * auVar135._0_4_;
          auVar51._8_4_ = auVar101._8_4_ * auVar135._8_4_;
          auVar51._12_4_ = auVar101._12_4_ * auVar135._12_4_;
          auVar51._16_4_ = auVar101._16_4_ * fVar77;
          auVar51._20_4_ = auVar101._20_4_ * fVar78;
          auVar51._24_4_ = auVar101._24_4_ * fVar141;
          auVar51._28_4_ = iVar2;
          auVar92 = vfmsub231ps_fma(auVar51,auVar134,auVar102);
          auVar194._0_4_ = auVar134._0_4_ * auVar113._0_4_;
          auVar194._4_4_ = auVar134._4_4_ * auVar113._4_4_;
          auVar194._8_4_ = auVar134._8_4_ * auVar113._8_4_;
          auVar194._12_4_ = auVar134._12_4_ * auVar113._12_4_;
          auVar194._16_4_ = fVar167 * auVar113._16_4_;
          auVar194._20_4_ = fVar176 * auVar113._20_4_;
          auVar194._24_4_ = fVar214 * auVar113._24_4_;
          auVar194._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar194,auVar101,auVar133);
          auVar115 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar108,auVar115);
          auVar107 = vfmadd231ps_avx512vl(auVar115,auVar108,ZEXT1632(auVar92));
          auVar197 = ZEXT3264(auVar107);
          auVar115 = vmaxps_avx(auVar106,auVar107);
          uVar163 = vcmpps_avx512vl(auVar115,auVar108,2);
          bVar75 = bVar75 & (byte)uVar163;
          if (bVar75 != 0) {
            auVar52._4_4_ = auVar102._4_4_ * auVar116._4_4_;
            auVar52._0_4_ = auVar102._0_4_ * auVar116._0_4_;
            auVar52._8_4_ = auVar102._8_4_ * auVar116._8_4_;
            auVar52._12_4_ = auVar102._12_4_ * auVar116._12_4_;
            auVar52._16_4_ = auVar102._16_4_ * auVar116._16_4_;
            auVar52._20_4_ = auVar102._20_4_ * auVar116._20_4_;
            auVar52._24_4_ = auVar102._24_4_ * auVar116._24_4_;
            auVar52._28_4_ = auVar115._28_4_;
            auVar88 = vfmsub231ps_fma(auVar52,auVar101,auVar114);
            auVar53._4_4_ = auVar114._4_4_ * auVar113._4_4_;
            auVar53._0_4_ = auVar114._0_4_ * auVar113._0_4_;
            auVar53._8_4_ = auVar114._8_4_ * auVar113._8_4_;
            auVar53._12_4_ = auVar114._12_4_ * auVar113._12_4_;
            auVar53._16_4_ = auVar114._16_4_ * auVar113._16_4_;
            auVar53._20_4_ = auVar114._20_4_ * auVar113._20_4_;
            auVar53._24_4_ = auVar114._24_4_ * auVar113._24_4_;
            auVar53._28_4_ = auVar114._28_4_;
            auVar94 = vfmsub231ps_fma(auVar53,auVar112,auVar102);
            auVar54._4_4_ = auVar101._4_4_ * auVar112._4_4_;
            auVar54._0_4_ = auVar101._0_4_ * auVar112._0_4_;
            auVar54._8_4_ = auVar101._8_4_ * auVar112._8_4_;
            auVar54._12_4_ = auVar101._12_4_ * auVar112._12_4_;
            auVar54._16_4_ = auVar101._16_4_ * auVar112._16_4_;
            auVar54._20_4_ = auVar101._20_4_ * auVar112._20_4_;
            auVar54._24_4_ = auVar101._24_4_ * auVar112._24_4_;
            auVar54._28_4_ = auVar101._28_4_;
            auVar84 = vfmsub231ps_fma(auVar54,auVar113,auVar116);
            auVar92 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar84));
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar88),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar115 = vrcp14ps_avx512vl(ZEXT1632(auVar95));
            auVar28._8_4_ = 0x3f800000;
            auVar28._0_8_ = 0x3f8000003f800000;
            auVar28._12_4_ = 0x3f800000;
            auVar28._16_4_ = 0x3f800000;
            auVar28._20_4_ = 0x3f800000;
            auVar28._24_4_ = 0x3f800000;
            auVar28._28_4_ = 0x3f800000;
            auVar116 = vfnmadd213ps_avx512vl(auVar115,ZEXT1632(auVar95),auVar28);
            auVar92 = vfmadd132ps_fma(auVar116,auVar115,auVar115);
            auVar207 = ZEXT1664(auVar92);
            auVar55._4_4_ = auVar84._4_4_ * auVar132._4_4_;
            auVar55._0_4_ = auVar84._0_4_ * auVar132._0_4_;
            auVar55._8_4_ = auVar84._8_4_ * auVar132._8_4_;
            auVar55._12_4_ = auVar84._12_4_ * auVar132._12_4_;
            auVar55._16_4_ = fVar168 * 0.0;
            auVar55._20_4_ = fVar212 * 0.0;
            auVar55._24_4_ = fVar213 * 0.0;
            auVar55._28_4_ = iVar1;
            auVar94 = vfmadd231ps_fma(auVar55,auVar103,ZEXT1632(auVar94));
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar111,ZEXT1632(auVar88));
            fVar168 = auVar92._0_4_;
            fVar212 = auVar92._4_4_;
            fVar213 = auVar92._8_4_;
            fVar214 = auVar92._12_4_;
            local_400._28_4_ = auVar115._28_4_;
            local_400._0_28_ =
                 ZEXT1628(CONCAT412(auVar94._12_4_ * fVar214,
                                    CONCAT48(auVar94._8_4_ * fVar213,
                                             CONCAT44(auVar94._4_4_ * fVar212,
                                                      auVar94._0_4_ * fVar168))));
            auVar209 = ZEXT3264(local_400);
            auVar65._4_4_ = uStack_55c;
            auVar65._0_4_ = local_560;
            auVar65._8_4_ = uStack_558;
            auVar65._12_4_ = uStack_554;
            auVar65._16_4_ = uStack_550;
            auVar65._20_4_ = uStack_54c;
            auVar65._24_4_ = uStack_548;
            auVar65._28_4_ = uStack_544;
            uVar163 = vcmpps_avx512vl(local_400,auVar65,0xd);
            uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar29._4_4_ = uVar162;
            auVar29._0_4_ = uVar162;
            auVar29._8_4_ = uVar162;
            auVar29._12_4_ = uVar162;
            auVar29._16_4_ = uVar162;
            auVar29._20_4_ = uVar162;
            auVar29._24_4_ = uVar162;
            auVar29._28_4_ = uVar162;
            uVar22 = vcmpps_avx512vl(local_400,auVar29,2);
            bVar75 = (byte)uVar163 & (byte)uVar22 & bVar75;
            if (bVar75 != 0) {
              uVar76 = vcmpps_avx512vl(ZEXT1632(auVar95),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar76 = bVar75 & uVar76;
              if ((char)uVar76 != '\0') {
                fVar167 = auVar106._0_4_ * fVar168;
                fVar176 = auVar106._4_4_ * fVar212;
                auVar56._4_4_ = fVar176;
                auVar56._0_4_ = fVar167;
                fVar77 = auVar106._8_4_ * fVar213;
                auVar56._8_4_ = fVar77;
                fVar78 = auVar106._12_4_ * fVar214;
                auVar56._12_4_ = fVar78;
                fVar141 = auVar106._16_4_ * 0.0;
                auVar56._16_4_ = fVar141;
                fVar142 = auVar106._20_4_ * 0.0;
                auVar56._20_4_ = fVar142;
                fVar143 = auVar106._24_4_ * 0.0;
                auVar56._24_4_ = fVar143;
                auVar56._28_4_ = auVar106._28_4_;
                auVar175._8_4_ = 0x3f800000;
                auVar175._0_8_ = 0x3f8000003f800000;
                auVar175._12_4_ = 0x3f800000;
                auVar175._16_4_ = 0x3f800000;
                auVar175._20_4_ = 0x3f800000;
                auVar175._24_4_ = 0x3f800000;
                auVar175._28_4_ = 0x3f800000;
                auVar115 = vsubps_avx(auVar175,auVar56);
                local_440._0_4_ =
                     (float)((uint)(bVar66 & 1) * (int)fVar167 |
                            (uint)!(bool)(bVar66 & 1) * auVar115._0_4_);
                bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                local_440._4_4_ =
                     (float)((uint)bVar12 * (int)fVar176 | (uint)!bVar12 * auVar115._4_4_);
                bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                local_440._8_4_ =
                     (float)((uint)bVar12 * (int)fVar77 | (uint)!bVar12 * auVar115._8_4_);
                bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                local_440._12_4_ =
                     (float)((uint)bVar12 * (int)fVar78 | (uint)!bVar12 * auVar115._12_4_);
                bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                local_440._16_4_ =
                     (float)((uint)bVar12 * (int)fVar141 | (uint)!bVar12 * auVar115._16_4_);
                bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                local_440._20_4_ =
                     (float)((uint)bVar12 * (int)fVar142 | (uint)!bVar12 * auVar115._20_4_);
                bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                local_440._24_4_ =
                     (float)((uint)bVar12 * (int)fVar143 | (uint)!bVar12 * auVar115._24_4_);
                bVar12 = SUB81(uVar67 >> 7,0);
                local_440._28_4_ =
                     (float)((uint)bVar12 * auVar106._28_4_ | (uint)!bVar12 * auVar115._28_4_);
                auVar115 = vsubps_avx(auVar105,auVar104);
                auVar92 = vfmadd213ps_fma(auVar115,local_440,auVar104);
                uVar162 = *(undefined4 *)((long)local_608->ray_space + k * 4 + -0x20);
                auVar30._4_4_ = uVar162;
                auVar30._0_4_ = uVar162;
                auVar30._8_4_ = uVar162;
                auVar30._12_4_ = uVar162;
                auVar30._16_4_ = uVar162;
                auVar30._20_4_ = uVar162;
                auVar30._24_4_ = uVar162;
                auVar30._28_4_ = uVar162;
                auVar115 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar92._12_4_ + auVar92._12_4_,
                                                              CONCAT48(auVar92._8_4_ + auVar92._8_4_
                                                                       ,CONCAT44(auVar92._4_4_ +
                                                                                 auVar92._4_4_,
                                                                                 auVar92._0_4_ +
                                                                                 auVar92._0_4_)))),
                                           auVar30);
                uVar21 = vcmpps_avx512vl(local_400,auVar115,6);
                uVar76 = uVar76 & uVar21;
                bVar75 = (byte)uVar76;
                if (bVar75 != 0) {
                  auVar166._0_4_ = auVar107._0_4_ * fVar168;
                  auVar166._4_4_ = auVar107._4_4_ * fVar212;
                  auVar166._8_4_ = auVar107._8_4_ * fVar213;
                  auVar166._12_4_ = auVar107._12_4_ * fVar214;
                  auVar166._16_4_ = auVar107._16_4_ * 0.0;
                  auVar166._20_4_ = auVar107._20_4_ * 0.0;
                  auVar166._24_4_ = auVar107._24_4_ * 0.0;
                  auVar166._28_4_ = 0;
                  auVar188._8_4_ = 0x3f800000;
                  auVar188._0_8_ = 0x3f8000003f800000;
                  auVar188._12_4_ = 0x3f800000;
                  auVar188._16_4_ = 0x3f800000;
                  auVar188._20_4_ = 0x3f800000;
                  auVar188._24_4_ = 0x3f800000;
                  auVar188._28_4_ = 0x3f800000;
                  auVar115 = vsubps_avx(auVar188,auVar166);
                  auVar137._0_4_ =
                       (uint)(bVar66 & 1) * (int)auVar166._0_4_ |
                       (uint)!(bool)(bVar66 & 1) * auVar115._0_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
                  auVar137._4_4_ =
                       (uint)bVar12 * (int)auVar166._4_4_ | (uint)!bVar12 * auVar115._4_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
                  auVar137._8_4_ =
                       (uint)bVar12 * (int)auVar166._8_4_ | (uint)!bVar12 * auVar115._8_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
                  auVar137._12_4_ =
                       (uint)bVar12 * (int)auVar166._12_4_ | (uint)!bVar12 * auVar115._12_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 4) & 1);
                  auVar137._16_4_ =
                       (uint)bVar12 * (int)auVar166._16_4_ | (uint)!bVar12 * auVar115._16_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
                  auVar137._20_4_ =
                       (uint)bVar12 * (int)auVar166._20_4_ | (uint)!bVar12 * auVar115._20_4_;
                  bVar12 = (bool)((byte)(uVar67 >> 6) & 1);
                  auVar137._24_4_ =
                       (uint)bVar12 * (int)auVar166._24_4_ | (uint)!bVar12 * auVar115._24_4_;
                  auVar137._28_4_ = (uint)!SUB81(uVar67 >> 7,0) * auVar115._28_4_;
                  auVar31._8_4_ = 0x40000000;
                  auVar31._0_8_ = 0x4000000040000000;
                  auVar31._12_4_ = 0x40000000;
                  auVar31._16_4_ = 0x40000000;
                  auVar31._20_4_ = 0x40000000;
                  auVar31._24_4_ = 0x40000000;
                  auVar31._28_4_ = 0x40000000;
                  local_420 = vfmsub132ps_avx512vl(auVar137,auVar188,auVar31);
                  local_3e0 = (undefined4)lVar70;
                  local_3d0 = local_670;
                  uStack_3c8 = uStack_668;
                  local_3c0 = local_680;
                  uStack_3b8 = uStack_678;
                  local_3b0 = local_690;
                  uStack_3a8 = uStack_688;
                  local_3a0 = local_6a0;
                  uStack_398 = uStack_698;
                  pGVar72 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar72->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    uVar74 = (uint)uVar76;
                    auVar92 = vcvtsi2ss_avx512f(auVar100,local_3e0);
                    fVar168 = auVar92._0_4_;
                    local_380[0] = (fVar168 + local_440._0_4_ + 0.0) * local_100;
                    local_380[1] = (fVar168 + local_440._4_4_ + 1.0) * fStack_fc;
                    local_380[2] = (fVar168 + local_440._8_4_ + 2.0) * fStack_f8;
                    local_380[3] = (fVar168 + local_440._12_4_ + 3.0) * fStack_f4;
                    fStack_370 = (fVar168 + local_440._16_4_ + 4.0) * fStack_f0;
                    fStack_36c = (fVar168 + local_440._20_4_ + 5.0) * fStack_ec;
                    fStack_368 = (fVar168 + local_440._24_4_ + 6.0) * fStack_e8;
                    fStack_364 = fVar168 + local_440._28_4_ + 7.0;
                    local_360 = local_420;
                    local_340 = local_400;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar115 = vblendmps_avx512vl(auVar157,local_400);
                    auVar138._0_4_ =
                         (uint)(bVar75 & 1) * auVar115._0_4_ |
                         (uint)!(bool)(bVar75 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar76 >> 1) & 1);
                    auVar138._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar76 >> 2) & 1);
                    auVar138._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                    auVar138._12_4_ = (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar76 >> 4) & 1);
                    auVar138._16_4_ = (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar76 >> 5) & 1);
                    auVar138._20_4_ = (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar76 >> 6) & 1);
                    auVar138._24_4_ = (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar76 >> 7,0);
                    auVar138._28_4_ = (uint)bVar12 * auVar115._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar115 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar115 = vminps_avx(auVar138,auVar115);
                    auVar116 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar116);
                    auVar116 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar116);
                    uVar163 = vcmpps_avx512vl(auVar138,auVar115,0);
                    if ((bVar75 & (byte)uVar163) != 0) {
                      uVar74 = (uint)(bVar75 & (byte)uVar163);
                    }
                    uVar68 = 0;
                    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                      uVar68 = uVar68 + 1;
                    }
                    uVar67 = (ulong)uVar68;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar72->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_630 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_618 = pGVar72;
                      local_5d8 = uVar69;
                      local_5c0 = local_400;
                      local_3dc = iVar7;
                      do {
                        local_1c0 = local_380[uVar67];
                        local_1a0 = *(undefined4 *)(local_360 + uVar67 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_340 + uVar67 * 4);
                        local_660.context = context->user;
                        fVar212 = 1.0 - local_1c0;
                        fVar168 = fVar212 * fVar212 * -3.0;
                        auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar212)),
                                                  ZEXT416((uint)(local_1c0 * fVar212)),
                                                  ZEXT416(0xc0000000));
                        auVar95 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar212)),
                                                  ZEXT416((uint)(local_1c0 * local_1c0)),
                                                  ZEXT416(0x40000000));
                        fVar212 = auVar92._0_4_ * 3.0;
                        fVar213 = auVar95._0_4_ * 3.0;
                        fVar214 = local_1c0 * local_1c0 * 3.0;
                        auVar201._0_4_ = fVar214 * fVar19;
                        auVar201._4_4_ = fVar214 * fVar57;
                        auVar201._8_4_ = fVar214 * fVar58;
                        auVar201._12_4_ = fVar214 * fVar59;
                        auVar150._4_4_ = fVar213;
                        auVar150._0_4_ = fVar213;
                        auVar150._8_4_ = fVar213;
                        auVar150._12_4_ = fVar213;
                        auVar92 = vfmadd132ps_fma(auVar150,auVar201,auVar90);
                        auVar184._4_4_ = fVar212;
                        auVar184._0_4_ = fVar212;
                        auVar184._8_4_ = fVar212;
                        auVar184._12_4_ = fVar212;
                        auVar92 = vfmadd132ps_fma(auVar184,auVar92,auVar20);
                        auVar151._4_4_ = fVar168;
                        auVar151._0_4_ = fVar168;
                        auVar151._8_4_ = fVar168;
                        auVar151._12_4_ = fVar168;
                        auVar92 = vfmadd132ps_fma(auVar151,auVar92,auVar93);
                        local_220 = auVar92._0_4_;
                        auVar195._8_4_ = 1;
                        auVar195._0_8_ = 0x100000001;
                        auVar195._12_4_ = 1;
                        auVar195._16_4_ = 1;
                        auVar195._20_4_ = 1;
                        auVar195._24_4_ = 1;
                        auVar195._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar195,ZEXT1632(auVar92));
                        auVar197 = ZEXT3264(local_200);
                        auVar202._8_4_ = 2;
                        auVar202._0_8_ = 0x200000002;
                        auVar202._12_4_ = 2;
                        auVar205._16_4_ = 2;
                        auVar205._0_16_ = auVar202;
                        auVar205._20_4_ = 2;
                        auVar205._24_4_ = 2;
                        auVar205._28_4_ = 2;
                        auVar207 = ZEXT3264(auVar205);
                        local_1e0 = vpermps_avx2(auVar205,ZEXT1632(auVar92));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2e0._0_8_;
                        uStack_178 = local_2e0._8_8_;
                        uStack_170 = local_2e0._16_8_;
                        uStack_168 = local_2e0._24_8_;
                        local_160 = local_2c0;
                        auVar115 = vpcmpeqd_avx2(local_2c0,local_2c0);
                        local_610[1] = auVar115;
                        *local_610 = auVar115;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_300;
                        local_660.valid = (int *)local_600;
                        local_660.geometryUserPtr = pGVar72->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar72->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar197 = ZEXT1664(local_200._0_16_);
                          auVar207 = ZEXT1664(auVar202);
                          (*pGVar72->intersectionFilterN)(&local_660);
                          auVar209 = ZEXT3264(local_5c0);
                          pGVar72 = local_618;
                        }
                        if (local_600 == (undefined1  [32])0x0) {
LAB_018b15c0:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_630._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar72->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            auVar207 = ZEXT1664(auVar207._0_16_);
                            (*p_Var11)(&local_660);
                            auVar209 = ZEXT3264(local_5c0);
                            pGVar72 = local_618;
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_018b15c0;
                          uVar69 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar60 = *(int *)(local_660.hit + 0xc);
                          iVar61 = *(int *)(local_660.hit + 0x10);
                          iVar62 = *(int *)(local_660.hit + 0x14);
                          iVar63 = *(int *)(local_660.hit + 0x18);
                          iVar64 = *(int *)(local_660.hit + 0x1c);
                          bVar75 = (byte)uVar69;
                          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                          bVar18 = SUB81(uVar69 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar75 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar16 * iVar62 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar17 * iVar63 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar18 * iVar64 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar60 = *(int *)(local_660.hit + 0x2c);
                          iVar61 = *(int *)(local_660.hit + 0x30);
                          iVar62 = *(int *)(local_660.hit + 0x34);
                          iVar63 = *(int *)(local_660.hit + 0x38);
                          iVar64 = *(int *)(local_660.hit + 0x3c);
                          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                          bVar18 = SUB81(uVar69 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar15 * iVar61 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar16 * iVar62 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar17 * iVar63 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar18 * iVar64 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar60 = *(int *)(local_660.hit + 0x4c);
                          iVar61 = *(int *)(local_660.hit + 0x50);
                          iVar62 = *(int *)(local_660.hit + 0x54);
                          iVar63 = *(int *)(local_660.hit + 0x58);
                          iVar64 = *(int *)(local_660.hit + 0x5c);
                          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                          bVar18 = SUB81(uVar69 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar15 * iVar61 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar16 * iVar62 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar17 * iVar63 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar18 * iVar64 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar60 = *(int *)(local_660.hit + 0x6c);
                          iVar61 = *(int *)(local_660.hit + 0x70);
                          iVar62 = *(int *)(local_660.hit + 0x74);
                          iVar63 = *(int *)(local_660.hit + 0x78);
                          iVar64 = *(int *)(local_660.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                          bVar18 = SUB81(uVar69 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar15 * iVar61 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar17 * iVar63 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar18 * iVar64 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar60 = *(int *)(local_660.hit + 0x8c);
                          iVar61 = *(int *)(local_660.hit + 0x90);
                          iVar62 = *(int *)(local_660.hit + 0x94);
                          iVar63 = *(int *)(local_660.hit + 0x98);
                          iVar64 = *(int *)(local_660.hit + 0x9c);
                          bVar12 = (bool)((byte)(uVar69 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar69 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar69 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar69 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar69 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
                          bVar18 = SUB81(uVar69 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar75 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar75 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar14 * iVar60 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar15 * iVar61 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar16 * iVar62 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar17 * iVar63 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar18 * iVar64 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x21c);
                          auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar115;
                          auVar115 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar115;
                          auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar115;
                          auVar115 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar115;
                          local_630._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_630._4_4_ = 0;
                          local_630._8_4_ = 0;
                          local_630._12_4_ = 0;
                        }
                        bVar75 = ~(byte)(1 << ((uint)uVar67 & 0x1f)) & (byte)uVar76;
                        auVar158._4_4_ = local_630._0_4_;
                        auVar158._0_4_ = local_630._0_4_;
                        auVar158._8_4_ = local_630._0_4_;
                        auVar158._12_4_ = local_630._0_4_;
                        auVar158._16_4_ = local_630._0_4_;
                        auVar158._20_4_ = local_630._0_4_;
                        auVar158._24_4_ = local_630._0_4_;
                        auVar158._28_4_ = local_630._0_4_;
                        uVar163 = vcmpps_avx512vl(auVar209._0_32_,auVar158,2);
                        if ((bVar75 & (byte)uVar163) == 0) goto LAB_018b165f;
                        bVar75 = bVar75 & (byte)uVar163;
                        uVar74 = (uint)bVar75;
                        uVar76 = (ulong)uVar74;
                        auVar159._8_4_ = 0x7f800000;
                        auVar159._0_8_ = 0x7f8000007f800000;
                        auVar159._12_4_ = 0x7f800000;
                        auVar159._16_4_ = 0x7f800000;
                        auVar159._20_4_ = 0x7f800000;
                        auVar159._24_4_ = 0x7f800000;
                        auVar159._28_4_ = 0x7f800000;
                        auVar115 = vblendmps_avx512vl(auVar159,auVar209._0_32_);
                        auVar139._0_4_ =
                             (uint)(bVar75 & 1) * auVar115._0_4_ |
                             (uint)!(bool)(bVar75 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar75 >> 1 & 1);
                        auVar139._4_4_ = (uint)bVar12 * auVar115._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar75 >> 2 & 1);
                        auVar139._8_4_ = (uint)bVar12 * auVar115._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar75 >> 3 & 1);
                        auVar139._12_4_ =
                             (uint)bVar12 * auVar115._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar75 >> 4 & 1);
                        auVar139._16_4_ =
                             (uint)bVar12 * auVar115._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar75 >> 5 & 1);
                        auVar139._20_4_ =
                             (uint)bVar12 * auVar115._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar75 >> 6 & 1);
                        auVar139._24_4_ =
                             (uint)bVar12 * auVar115._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar139._28_4_ =
                             (uint)(bVar75 >> 7) * auVar115._28_4_ |
                             (uint)!(bool)(bVar75 >> 7) * 0x7f800000;
                        auVar115 = vshufps_avx(auVar139,auVar139,0xb1);
                        auVar115 = vminps_avx(auVar139,auVar115);
                        auVar116 = vshufpd_avx(auVar115,auVar115,5);
                        auVar115 = vminps_avx(auVar115,auVar116);
                        auVar116 = vpermpd_avx2(auVar115,0x4e);
                        auVar115 = vminps_avx(auVar115,auVar116);
                        uVar163 = vcmpps_avx512vl(auVar139,auVar115,0);
                        bVar75 = (byte)uVar163 & bVar75;
                        if (bVar75 != 0) {
                          uVar74 = (uint)bVar75;
                        }
                        uVar68 = 0;
                        for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                          uVar68 = uVar68 + 1;
                        }
                        uVar67 = (ulong)uVar68;
                      } while( true );
                    }
                    fVar168 = local_380[uVar67];
                    uVar162 = *(undefined4 *)(local_360 + uVar67 * 4);
                    fVar213 = 1.0 - fVar168;
                    fVar212 = fVar213 * fVar213 * -3.0;
                    auVar197 = ZEXT464((uint)fVar212);
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar213)),
                                              ZEXT416((uint)(fVar168 * fVar213)),ZEXT416(0xc0000000)
                                             );
                    auVar95 = vfmsub132ss_fma(ZEXT416((uint)(fVar168 * fVar213)),
                                              ZEXT416((uint)(fVar168 * fVar168)),ZEXT416(0x40000000)
                                             );
                    fVar213 = auVar92._0_4_ * 3.0;
                    fVar214 = auVar95._0_4_ * 3.0;
                    fVar167 = fVar168 * fVar168 * 3.0;
                    auVar200._0_4_ = fVar167 * fVar19;
                    auVar200._4_4_ = fVar167 * fVar57;
                    auVar200._8_4_ = fVar167 * fVar58;
                    auVar200._12_4_ = fVar167 * fVar59;
                    auVar207 = ZEXT1664(auVar200);
                    auVar172._4_4_ = fVar214;
                    auVar172._0_4_ = fVar214;
                    auVar172._8_4_ = fVar214;
                    auVar172._12_4_ = fVar214;
                    auVar92 = vfmadd132ps_fma(auVar172,auVar200,auVar90);
                    auVar183._4_4_ = fVar213;
                    auVar183._0_4_ = fVar213;
                    auVar183._8_4_ = fVar213;
                    auVar183._12_4_ = fVar213;
                    auVar92 = vfmadd132ps_fma(auVar183,auVar92,auVar20);
                    auVar173._4_4_ = fVar212;
                    auVar173._0_4_ = fVar212;
                    auVar173._8_4_ = fVar212;
                    auVar173._12_4_ = fVar212;
                    auVar92 = vfmadd132ps_fma(auVar173,auVar92,auVar93);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar67 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar92._0_4_;
                    uVar8 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                    uVar8 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar8;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar168;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar162;
                    *(int *)(ray + k * 4 + 0x220) = (int)uVar69;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_018b12ae;
      }
    }
    uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar24._4_4_ = uVar162;
    auVar24._0_4_ = uVar162;
    auVar24._8_4_ = uVar162;
    auVar24._12_4_ = uVar162;
    uVar163 = vcmpps_avx512vl(local_310,auVar24,2);
    local_5c8 = (ulong)((uint)local_5c8 & (uint)local_5c8 + 0xf & (uint)uVar163);
  } while( true );
LAB_018b165f:
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar229 = ZEXT1664(auVar92);
  auVar230 = ZEXT464(0xbf800000);
  uVar69 = local_5d8;
LAB_018b12ae:
  lVar70 = lVar70 + 8;
  goto LAB_018b09e1;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }